

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx2::CurveNvIntersectorK<4,4>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  ulong uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  uint uVar58;
  uint uVar59;
  ulong uVar60;
  long lVar61;
  uint uVar62;
  ulong uVar63;
  undefined4 uVar64;
  undefined8 unaff_R14;
  ulong uVar65;
  bool bVar66;
  float fVar67;
  undefined8 uVar68;
  float fVar93;
  vint4 bi_2;
  undefined1 auVar69 [16];
  float fVar92;
  float fVar94;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar72 [16];
  undefined1 auVar87 [32];
  undefined1 auVar78 [16];
  undefined1 auVar89 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  undefined1 extraout_var_00 [60];
  float fVar95;
  undefined8 extraout_XMM1_Qa;
  float fVar125;
  vint4 bi_1;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar111 [32];
  float fVar124;
  float fVar126;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  float fVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar145;
  float fVar170;
  vint4 ai_2;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  vint4 ai;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  vint4 bi;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [28];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar198;
  float fVar208;
  float fVar209;
  vint4 ai_1;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar207 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [64];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  float fVar247;
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  undefined1 auVar246 [64];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar254 [16];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c44;
  undefined1 local_c00 [8];
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  RTCFilterFunctionNArguments local_af0;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 (*local_a48) [16];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  undefined1 auStack_930 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  Primitive *local_8f0;
  Primitive *local_8e8;
  undefined4 local_8e0;
  undefined1 auStack_8dc [28];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined4 uStack_758;
  undefined4 uStack_754;
  uint local_750;
  uint uStack_74c;
  uint uStack_748;
  uint uStack_744;
  RTCHitN local_740 [16];
  undefined1 auStack_730 [16];
  undefined4 local_720;
  undefined4 uStack_71c;
  undefined4 uStack_718;
  undefined4 uStack_714;
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [16];
  uint local_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  uint uStack_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined4 uStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 extraout_var [60];
  undefined1 auVar123 [64];
  undefined1 auVar239 [16];
  undefined1 auVar255 [32];
  
  PVar1 = prim[1];
  uVar65 = (ulong)(byte)PVar1;
  local_8f0 = prim + uVar65 * 0x19 + 0x16;
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar67 = *(float *)(prim + uVar65 * 0x19 + 0x12);
  auVar5 = vsubps_avx(auVar5,*(undefined1 (*) [16])(prim + uVar65 * 0x19 + 6));
  auVar69._0_4_ = fVar67 * auVar5._0_4_;
  auVar69._4_4_ = fVar67 * auVar5._4_4_;
  auVar69._8_4_ = fVar67 * auVar5._8_4_;
  auVar69._12_4_ = fVar67 * auVar5._12_4_;
  auVar184._0_4_ = fVar67 * auVar6._0_4_;
  auVar184._4_4_ = fVar67 * auVar6._4_4_;
  auVar184._8_4_ = fVar67 * auVar6._8_4_;
  auVar184._12_4_ = fVar67 * auVar6._12_4_;
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 4 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 5 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 6 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0xb + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0xc + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0xd + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x12 + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x13 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x14 + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar261._4_4_ = auVar184._0_4_;
  auVar261._0_4_ = auVar184._0_4_;
  auVar261._8_4_ = auVar184._0_4_;
  auVar261._12_4_ = auVar184._0_4_;
  auVar97 = vshufps_avx(auVar184,auVar184,0x55);
  auVar74 = vshufps_avx(auVar184,auVar184,0xaa);
  fVar67 = auVar74._0_4_;
  auVar234._0_4_ = fVar67 * auVar7._0_4_;
  fVar92 = auVar74._4_4_;
  auVar234._4_4_ = fVar92 * auVar7._4_4_;
  fVar93 = auVar74._8_4_;
  auVar234._8_4_ = fVar93 * auVar7._8_4_;
  fVar94 = auVar74._12_4_;
  auVar234._12_4_ = fVar94 * auVar7._12_4_;
  auVar229._0_4_ = auVar9._0_4_ * fVar67;
  auVar229._4_4_ = auVar9._4_4_ * fVar92;
  auVar229._8_4_ = auVar9._8_4_ * fVar93;
  auVar229._12_4_ = auVar9._12_4_ * fVar94;
  auVar214._0_4_ = auVar80._0_4_ * fVar67;
  auVar214._4_4_ = auVar80._4_4_ * fVar92;
  auVar214._8_4_ = auVar80._8_4_ * fVar93;
  auVar214._12_4_ = auVar80._12_4_ * fVar94;
  auVar74 = vfmadd231ps_fma(auVar234,auVar97,auVar6);
  auVar98 = vfmadd231ps_fma(auVar229,auVar97,auVar77);
  auVar97 = vfmadd231ps_fma(auVar214,auVar70,auVar97);
  auVar146 = vfmadd231ps_fma(auVar74,auVar261,auVar5);
  auVar98 = vfmadd231ps_fma(auVar98,auVar261,auVar8);
  auVar172 = vfmadd231ps_fma(auVar97,auVar71,auVar261);
  auVar262._4_4_ = auVar69._0_4_;
  auVar262._0_4_ = auVar69._0_4_;
  auVar262._8_4_ = auVar69._0_4_;
  auVar262._12_4_ = auVar69._0_4_;
  auVar97 = vshufps_avx(auVar69,auVar69,0x55);
  auVar74 = vshufps_avx(auVar69,auVar69,0xaa);
  fVar67 = auVar74._0_4_;
  auVar185._0_4_ = fVar67 * auVar7._0_4_;
  fVar92 = auVar74._4_4_;
  auVar185._4_4_ = fVar92 * auVar7._4_4_;
  fVar93 = auVar74._8_4_;
  auVar185._8_4_ = fVar93 * auVar7._8_4_;
  fVar94 = auVar74._12_4_;
  auVar185._12_4_ = fVar94 * auVar7._12_4_;
  auVar96._0_4_ = auVar9._0_4_ * fVar67;
  auVar96._4_4_ = auVar9._4_4_ * fVar92;
  auVar96._8_4_ = auVar9._8_4_ * fVar93;
  auVar96._12_4_ = auVar9._12_4_ * fVar94;
  auVar74._0_4_ = auVar80._0_4_ * fVar67;
  auVar74._4_4_ = auVar80._4_4_ * fVar92;
  auVar74._8_4_ = auVar80._8_4_ * fVar93;
  auVar74._12_4_ = auVar80._12_4_ * fVar94;
  auVar6 = vfmadd231ps_fma(auVar185,auVar97,auVar6);
  auVar7 = vfmadd231ps_fma(auVar96,auVar97,auVar77);
  auVar77 = vfmadd231ps_fma(auVar74,auVar97,auVar70);
  auVar9 = vfmadd231ps_fma(auVar6,auVar262,auVar5);
  auVar70 = vfmadd231ps_fma(auVar7,auVar262,auVar8);
  auVar80 = vfmadd231ps_fma(auVar77,auVar262,auVar71);
  auVar225._8_4_ = 0x7fffffff;
  auVar225._0_8_ = 0x7fffffff7fffffff;
  auVar225._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx(auVar146,auVar225);
  auVar171._8_4_ = 0x219392ef;
  auVar171._0_8_ = 0x219392ef219392ef;
  auVar171._12_4_ = 0x219392ef;
  auVar5 = vcmpps_avx(auVar5,auVar171,1);
  auVar6 = vblendvps_avx(auVar146,auVar171,auVar5);
  auVar5 = vandps_avx(auVar98,auVar225);
  auVar5 = vcmpps_avx(auVar5,auVar171,1);
  auVar7 = vblendvps_avx(auVar98,auVar171,auVar5);
  auVar5 = vandps_avx(auVar225,auVar172);
  auVar5 = vcmpps_avx(auVar5,auVar171,1);
  auVar5 = vblendvps_avx(auVar172,auVar171,auVar5);
  auVar8 = vrcpps_avx(auVar6);
  auVar215._8_4_ = 0x3f800000;
  auVar215._0_8_ = 0x3f8000003f800000;
  auVar215._12_4_ = 0x3f800000;
  auVar6 = vfnmadd213ps_fma(auVar6,auVar8,auVar215);
  auVar8 = vfmadd132ps_fma(auVar6,auVar8,auVar8);
  auVar6 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar6,auVar215);
  auVar77 = vfmadd132ps_fma(auVar7,auVar6,auVar6);
  auVar6 = vrcpps_avx(auVar5);
  auVar5 = vfnmadd213ps_fma(auVar5,auVar6,auVar215);
  auVar71 = vfmadd132ps_fma(auVar5,auVar6,auVar6);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar65 * 7 + 6);
  auVar5 = vpmovsxwd_avx(auVar5);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar9);
  auVar172._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar172._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar172._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar172._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar65 * 9 + 6);
  auVar5 = vpmovsxwd_avx(auVar6);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar9);
  auVar186._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar186._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar186._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar186._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar65 * 0xe + 6);
  auVar5 = vpmovsxwd_avx(auVar7);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar70);
  auVar199._0_4_ = auVar77._0_4_ * auVar5._0_4_;
  auVar199._4_4_ = auVar77._4_4_ * auVar5._4_4_;
  auVar199._8_4_ = auVar77._8_4_ * auVar5._8_4_;
  auVar199._12_4_ = auVar77._12_4_ * auVar5._12_4_;
  auVar98._1_3_ = 0;
  auVar98[0] = PVar1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar5 = vpmovsxwd_avx(auVar8);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar70);
  auVar97._0_4_ = auVar77._0_4_ * auVar5._0_4_;
  auVar97._4_4_ = auVar77._4_4_ * auVar5._4_4_;
  auVar97._8_4_ = auVar77._8_4_ * auVar5._8_4_;
  auVar97._12_4_ = auVar77._12_4_ * auVar5._12_4_;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar65 * 0x15 + 6);
  auVar5 = vpmovsxwd_avx(auVar77);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar80);
  auVar146._0_4_ = auVar71._0_4_ * auVar5._0_4_;
  auVar146._4_4_ = auVar71._4_4_ * auVar5._4_4_;
  auVar146._8_4_ = auVar71._8_4_ * auVar5._8_4_;
  auVar146._12_4_ = auVar71._12_4_ * auVar5._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar65 * 0x17 + 6);
  auVar5 = vpmovsxwd_avx(auVar9);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar80);
  auVar70._0_4_ = auVar71._0_4_ * auVar5._0_4_;
  auVar70._4_4_ = auVar71._4_4_ * auVar5._4_4_;
  auVar70._8_4_ = auVar71._8_4_ * auVar5._8_4_;
  auVar70._12_4_ = auVar71._12_4_ * auVar5._12_4_;
  auVar5 = vpminsd_avx(auVar172,auVar186);
  auVar6 = vpminsd_avx(auVar199,auVar97);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  auVar6 = vpminsd_avx(auVar146,auVar70);
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar230._4_4_ = uVar64;
  auVar230._0_4_ = uVar64;
  auVar230._8_4_ = uVar64;
  auVar230._12_4_ = uVar64;
  auVar6 = vmaxps_avx(auVar6,auVar230);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  local_5a0._0_4_ = auVar5._0_4_ * 0.99999964;
  local_5a0._4_4_ = auVar5._4_4_ * 0.99999964;
  local_5a0._8_4_ = auVar5._8_4_ * 0.99999964;
  local_5a0._12_4_ = auVar5._12_4_ * 0.99999964;
  auVar5 = vpmaxsd_avx(auVar172,auVar186);
  auVar6 = vpmaxsd_avx(auVar199,auVar97);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar6 = vpmaxsd_avx(auVar146,auVar70);
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar80._4_4_ = uVar64;
  auVar80._0_4_ = uVar64;
  auVar80._8_4_ = uVar64;
  auVar80._12_4_ = uVar64;
  auVar6 = vminps_avx(auVar6,auVar80);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar71._0_4_ = auVar5._0_4_ * 1.0000004;
  auVar71._4_4_ = auVar5._4_4_ * 1.0000004;
  auVar71._8_4_ = auVar5._8_4_ * 1.0000004;
  auVar71._12_4_ = auVar5._12_4_ * 1.0000004;
  auVar98[4] = PVar1;
  auVar98._5_3_ = 0;
  auVar98[8] = PVar1;
  auVar98._9_3_ = 0;
  auVar98[0xc] = PVar1;
  auVar98._13_3_ = 0;
  auVar6 = vpcmpgtd_avx(auVar98,_DAT_01f4ad30);
  auVar5 = vcmpps_avx(local_5a0,auVar71,2);
  auVar5 = vandps_avx(auVar5,auVar6);
  uVar64 = vmovmskps_avx(auVar5);
  uVar65 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar64);
  auVar85._16_16_ = mm_lookupmask_ps._240_16_;
  auVar85._0_16_ = mm_lookupmask_ps._240_16_;
  local_520 = vblendps_avx(auVar85,ZEXT832(0) << 0x20,0x80);
  local_a48 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_8e8 = prim;
LAB_010ebc3d:
  if (uVar65 == 0) {
    return;
  }
  lVar61 = 0;
  for (uVar60 = uVar65; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    lVar61 = lVar61 + 1;
  }
  uVar65 = uVar65 - 1 & uVar65;
  local_8e0 = *(undefined4 *)(local_8e8 + lVar61 * 4 + 6);
  uVar60 = (ulong)(uint)((int)lVar61 << 6);
  auVar5 = *(undefined1 (*) [16])(local_8f0 + uVar60);
  if (uVar65 != 0) {
    uVar63 = uVar65 - 1 & uVar65;
    for (uVar13 = uVar65; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
    }
    if (uVar63 != 0) {
      for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar6 = *(undefined1 (*) [16])(local_8f0 + uVar60 + 0x10);
  auVar7 = *(undefined1 (*) [16])(local_8f0 + uVar60 + 0x20);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar9 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar244._4_4_ = uVar64;
  auVar244._0_4_ = uVar64;
  auVar244._8_4_ = uVar64;
  auVar244._12_4_ = uVar64;
  fStack_650 = (float)uVar64;
  _local_660 = auVar244;
  fStack_64c = (float)uVar64;
  fStack_648 = (float)uVar64;
  register0x0000151c = uVar64;
  auVar8 = *(undefined1 (*) [16])(local_8f0 + uVar60 + 0x30);
  uVar64 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar239._4_4_ = uVar64;
  auVar239._0_4_ = uVar64;
  auVar239._8_4_ = uVar64;
  auVar239._12_4_ = uVar64;
  fStack_630 = (float)uVar64;
  _local_640 = auVar239;
  fStack_62c = (float)uVar64;
  fStack_628 = (float)uVar64;
  register0x000014dc = uVar64;
  auVar243 = ZEXT3264(_local_640);
  auVar77 = vunpcklps_avx(auVar244,auVar239);
  fVar67 = *(float *)(ray + k * 4 + 0x60);
  auVar235._4_4_ = fVar67;
  auVar235._0_4_ = fVar67;
  auVar235._8_4_ = fVar67;
  auVar235._12_4_ = fVar67;
  fStack_890 = fVar67;
  _local_8a0 = auVar235;
  fStack_88c = fVar67;
  fStack_888 = fVar67;
  register0x0000149c = fVar67;
  local_970 = vinsertps_avx(auVar77,auVar235,0x28);
  auVar187._0_4_ = (auVar5._0_4_ + auVar6._0_4_ + auVar7._0_4_ + auVar8._0_4_) * 0.25;
  auVar187._4_4_ = (auVar5._4_4_ + auVar6._4_4_ + auVar7._4_4_ + auVar8._4_4_) * 0.25;
  auVar187._8_4_ = (auVar5._8_4_ + auVar6._8_4_ + auVar7._8_4_ + auVar8._8_4_) * 0.25;
  auVar187._12_4_ = (auVar5._12_4_ + auVar6._12_4_ + auVar7._12_4_ + auVar8._12_4_) * 0.25;
  auVar77 = vsubps_avx(auVar187,auVar9);
  auVar77 = vdpps_avx(auVar77,local_970,0x7f);
  local_980 = vdpps_avx(local_970,local_970,0x7f);
  auVar233 = ZEXT1664(local_980);
  uVar59 = *(uint *)(local_8e8 + 2);
  auVar71 = vrcpss_avx(local_980,local_980);
  auVar70 = vfnmadd213ss_fma(auVar71,local_980,ZEXT416(0x40000000));
  local_3e0 = auVar77._0_4_ * auVar71._0_4_ * auVar70._0_4_;
  auVar200._4_4_ = local_3e0;
  auVar200._0_4_ = local_3e0;
  auVar200._8_4_ = local_3e0;
  auVar200._12_4_ = local_3e0;
  fStack_8b0 = local_3e0;
  _local_8c0 = auVar200;
  fStack_8ac = local_3e0;
  fStack_8a8 = local_3e0;
  fStack_8a4 = local_3e0;
  auVar77 = vfmadd231ps_fma(auVar9,local_970,auVar200);
  auVar77 = vblendps_avx(auVar77,_DAT_01f45a50,8);
  auVar9 = vsubps_avx(auVar5,auVar77);
  auVar71 = vsubps_avx(auVar7,auVar77);
  auVar70 = vsubps_avx(auVar6,auVar77);
  auVar8 = vsubps_avx(auVar8,auVar77);
  auVar5 = vmovshdup_avx(auVar9);
  local_1e0 = auVar5._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar5 = vshufps_avx(auVar9,auVar9,0xaa);
  uVar68 = auVar5._0_8_;
  auVar218._8_8_ = uVar68;
  auVar218._0_8_ = uVar68;
  auVar218._16_8_ = uVar68;
  auVar218._24_8_ = uVar68;
  auVar5 = vshufps_avx(auVar9,auVar9,0xff);
  uVar68 = auVar5._0_8_;
  auVar204._8_8_ = uVar68;
  auVar204._0_8_ = uVar68;
  auVar204._16_8_ = uVar68;
  auVar204._24_8_ = uVar68;
  auVar5 = vmovshdup_avx(auVar70);
  uVar68 = auVar5._0_8_;
  auVar179._8_8_ = uVar68;
  auVar179._0_8_ = uVar68;
  auVar179._16_8_ = uVar68;
  auVar179._24_8_ = uVar68;
  auVar5 = vshufps_avx(auVar70,auVar70,0xaa);
  local_960 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar70,auVar70,0xff);
  uVar68 = auVar5._0_8_;
  auVar255._8_8_ = uVar68;
  auVar255._0_8_ = uVar68;
  auVar255._16_8_ = uVar68;
  auVar255._24_8_ = uVar68;
  auVar259 = ZEXT3264(auVar255);
  auVar5 = vmovshdup_avx(auVar71);
  uVar68 = auVar5._0_8_;
  local_500._8_8_ = uVar68;
  local_500._0_8_ = uVar68;
  local_500._16_8_ = uVar68;
  local_500._24_8_ = uVar68;
  auVar6 = vshufps_avx(auVar71,auVar71,0xaa);
  uVar68 = auVar6._0_8_;
  auVar267._8_8_ = uVar68;
  auVar267._0_8_ = uVar68;
  auVar267._16_8_ = uVar68;
  auVar267._24_8_ = uVar68;
  auVar5 = vshufps_avx(auVar71,auVar71,0xff);
  local_200 = auVar5._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar5 = vmovshdup_avx(auVar8);
  local_220 = auVar5._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar5 = vshufps_avx(auVar8,auVar8,0xaa);
  local_240 = auVar5._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar5 = vshufps_avx(auVar8,auVar8,0xff);
  local_260 = auVar5._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar5 = vfmadd231ps_fma(ZEXT432((uint)(fVar67 * fVar67)),_local_640,_local_640);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),_local_660,_local_660);
  uVar64 = auVar5._0_4_;
  local_280._4_4_ = uVar64;
  local_280._0_4_ = uVar64;
  local_280._8_4_ = uVar64;
  local_280._12_4_ = uVar64;
  local_280._16_4_ = uVar64;
  local_280._20_4_ = uVar64;
  local_280._24_4_ = uVar64;
  local_280._28_4_ = uVar64;
  auVar238 = ZEXT3264(local_280);
  fVar67 = *(float *)(ray + k * 4 + 0x30);
  local_910 = ZEXT416((uint)local_3e0);
  local_3e0 = fVar67 - local_3e0;
  fStack_3dc = local_3e0;
  fStack_3d8 = local_3e0;
  fStack_3d4 = local_3e0;
  fStack_3d0 = local_3e0;
  fStack_3cc = local_3e0;
  fStack_3c8 = local_3e0;
  fStack_3c4 = local_3e0;
  uVar60 = 0;
  local_c44 = 1;
  uVar64 = auVar9._0_4_;
  local_3a0._4_4_ = uVar64;
  local_3a0._0_4_ = uVar64;
  local_3a0._8_4_ = uVar64;
  local_3a0._12_4_ = uVar64;
  local_3a0._16_4_ = uVar64;
  local_3a0._20_4_ = uVar64;
  local_3a0._24_4_ = uVar64;
  local_3a0._28_4_ = uVar64;
  fVar92 = auVar70._0_4_;
  local_3c0._4_4_ = fVar92;
  local_3c0._0_4_ = fVar92;
  local_3c0._8_4_ = fVar92;
  local_3c0._12_4_ = fVar92;
  local_3c0._16_4_ = fVar92;
  local_3c0._20_4_ = fVar92;
  local_3c0._24_4_ = fVar92;
  local_3c0._28_4_ = fVar92;
  fVar93 = auVar71._0_4_;
  local_2a0 = fVar93;
  fStack_29c = fVar93;
  fStack_298 = fVar93;
  fStack_294 = fVar93;
  fStack_290 = fVar93;
  fStack_28c = fVar93;
  fStack_288 = fVar93;
  fStack_284 = fVar93;
  fVar94 = auVar8._0_4_;
  local_2c0 = fVar94;
  fStack_2bc = fVar94;
  fStack_2b8 = fVar94;
  fStack_2b4 = fVar94;
  fStack_2b0 = fVar94;
  fStack_2ac = fVar94;
  fStack_2a8 = fVar94;
  fStack_2a4 = fVar94;
  local_680._8_4_ = 0x7fffffff;
  local_680._0_8_ = 0x7fffffff7fffffff;
  local_680._12_4_ = 0x7fffffff;
  local_680._16_4_ = 0x7fffffff;
  local_680._20_4_ = 0x7fffffff;
  local_680._24_4_ = 0x7fffffff;
  local_680._28_4_ = 0x7fffffff;
  local_580 = vandps_avx(local_280,local_680);
  auVar5 = vsqrtss_avx(local_980,local_980);
  auVar7 = vsqrtss_avx(local_980,local_980);
  auVar246 = ZEXT3264(CONCAT824(local_960,CONCAT816(local_960,CONCAT88(local_960,local_960))));
  local_590 = ZEXT816(0x3f80000000000000);
  local_540 = auVar218;
  local_560 = auVar179;
  local_9e0 = auVar204;
  uStack_958 = local_960;
  uStack_950 = local_960;
  uStack_948 = local_960;
  local_760 = local_8e0;
  uStack_75c = local_8e0;
  uStack_758 = local_8e0;
  uStack_754 = local_8e0;
  local_750 = uVar59;
  uStack_74c = uVar59;
  uStack_748 = uVar59;
  uStack_744 = uVar59;
  do {
    auVar77 = vmovshdup_avx(local_590);
    auVar77 = vsubps_avx(auVar77,local_590);
    fVar142 = auVar77._0_4_;
    fVar129 = fVar142 * 0.04761905;
    local_7a0._0_4_ = local_590._0_4_;
    local_7a0._4_4_ = local_7a0._0_4_;
    local_7a0._8_4_ = local_7a0._0_4_;
    local_7a0._12_4_ = local_7a0._0_4_;
    local_7a0._16_4_ = local_7a0._0_4_;
    local_7a0._20_4_ = local_7a0._0_4_;
    local_7a0._24_4_ = local_7a0._0_4_;
    local_7a0._28_4_ = local_7a0._0_4_;
    local_7c0._4_4_ = fVar142;
    local_7c0._0_4_ = fVar142;
    local_7c0._8_4_ = fVar142;
    local_7c0._12_4_ = fVar142;
    local_7c0._16_4_ = fVar142;
    local_7c0._20_4_ = fVar142;
    local_7c0._24_4_ = fVar142;
    local_7c0._28_4_ = fVar142;
    auVar77 = vfmadd231ps_fma(local_7a0,local_7c0,_DAT_01f7b040);
    auVar111._8_4_ = 0x3f800000;
    auVar111._0_8_ = 0x3f8000003f800000;
    auVar111._12_4_ = 0x3f800000;
    auVar111._16_4_ = 0x3f800000;
    auVar111._20_4_ = 0x3f800000;
    auVar111._24_4_ = 0x3f800000;
    auVar111._28_4_ = 0x3f800000;
    auVar85 = vsubps_avx(auVar111,ZEXT1632(auVar77));
    fVar130 = auVar77._0_4_;
    auVar207._0_4_ = local_3c0._0_4_ * fVar130;
    fVar95 = auVar77._4_4_;
    auVar207._4_4_ = local_3c0._4_4_ * fVar95;
    fVar141 = auVar77._8_4_;
    auVar207._8_4_ = local_3c0._8_4_ * fVar141;
    fVar124 = auVar77._12_4_;
    auVar207._12_4_ = local_3c0._12_4_ * fVar124;
    auVar207._16_4_ = local_3c0._16_4_ * 0.0;
    auVar207._20_4_ = local_3c0._20_4_ * 0.0;
    auVar207._28_36_ = auVar243._28_36_;
    auVar207._24_4_ = local_3c0._24_4_ * 0.0;
    auVar243._0_4_ = auVar179._0_4_ * fVar130;
    auVar243._4_4_ = auVar179._4_4_ * fVar95;
    auVar243._8_4_ = auVar179._8_4_ * fVar141;
    auVar243._12_4_ = auVar179._12_4_ * fVar124;
    auVar243._16_4_ = auVar179._16_4_ * 0.0;
    auVar243._20_4_ = auVar179._20_4_ * 0.0;
    auVar243._28_36_ = auVar238._28_36_;
    auVar243._24_4_ = auVar179._24_4_ * 0.0;
    auVar238._0_4_ = auVar246._0_4_ * fVar130;
    auVar238._4_4_ = auVar246._4_4_ * fVar95;
    auVar238._8_4_ = auVar246._8_4_ * fVar141;
    auVar238._12_4_ = auVar246._12_4_ * fVar124;
    auVar238._16_4_ = auVar246._16_4_ * 0.0;
    auVar238._20_4_ = auVar246._20_4_ * 0.0;
    auVar238._28_36_ = auVar233._28_36_;
    auVar238._24_4_ = auVar246._24_4_ * 0.0;
    auVar165._4_4_ = auVar259._4_4_ * fVar95;
    auVar165._0_4_ = auVar259._0_4_ * fVar130;
    auVar165._8_4_ = auVar259._8_4_ * fVar141;
    auVar165._12_4_ = auVar259._12_4_ * fVar124;
    auVar165._16_4_ = auVar259._16_4_ * 0.0;
    auVar165._20_4_ = auVar259._20_4_ * 0.0;
    auVar165._24_4_ = auVar259._24_4_ * 0.0;
    auVar165._28_4_ = fVar142;
    auVar77 = vfmadd231ps_fma(auVar207._0_32_,auVar85,local_3a0);
    auVar54._8_8_ = uStack_1d8;
    auVar54._0_8_ = local_1e0;
    auVar54._16_8_ = uStack_1d0;
    auVar54._24_8_ = uStack_1c8;
    auVar80 = vfmadd231ps_fma(auVar243._0_32_,auVar85,auVar54);
    auVar97 = vfmadd231ps_fma(auVar238._0_32_,auVar85,auVar218);
    auVar74 = vfmadd231ps_fma(auVar165,auVar85,auVar204);
    auVar52._4_4_ = fStack_29c;
    auVar52._0_4_ = local_2a0;
    auVar52._8_4_ = fStack_298;
    auVar52._12_4_ = fStack_294;
    auVar52._16_4_ = fStack_290;
    auVar52._20_4_ = fStack_28c;
    auVar52._24_4_ = fStack_288;
    auVar52._28_4_ = fStack_284;
    auVar168._4_4_ = fStack_29c * fVar95;
    auVar168._0_4_ = local_2a0 * fVar130;
    auVar168._8_4_ = fStack_298 * fVar141;
    auVar168._12_4_ = fStack_294 * fVar124;
    auVar168._16_4_ = fStack_290 * 0.0;
    auVar168._20_4_ = fStack_28c * 0.0;
    auVar168._24_4_ = fStack_288 * 0.0;
    auVar168._28_4_ = auVar204._28_4_;
    auVar182._4_4_ = local_500._4_4_ * fVar95;
    auVar182._0_4_ = local_500._0_4_ * fVar130;
    auVar182._8_4_ = local_500._8_4_ * fVar141;
    auVar182._12_4_ = local_500._12_4_ * fVar124;
    auVar182._16_4_ = local_500._16_4_ * 0.0;
    auVar182._20_4_ = local_500._20_4_ * 0.0;
    auVar182._24_4_ = local_500._24_4_ * 0.0;
    auVar182._28_4_ = auVar218._28_4_;
    fVar142 = auVar6._0_4_;
    fVar143 = auVar6._4_4_;
    auVar11._4_4_ = fVar143 * fVar95;
    auVar11._0_4_ = fVar142 * fVar130;
    auVar11._8_4_ = fVar142 * fVar141;
    auVar11._12_4_ = fVar143 * fVar124;
    auVar11._16_4_ = fVar142 * 0.0;
    auVar11._20_4_ = fVar143 * 0.0;
    auVar11._24_4_ = fVar142 * 0.0;
    auVar11._28_4_ = local_3a0._28_4_;
    auVar53._8_8_ = uStack_1f8;
    auVar53._0_8_ = local_200;
    auVar53._16_8_ = uStack_1f0;
    auVar53._24_8_ = uStack_1e8;
    auVar56._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar95;
    auVar56._0_4_ = (float)local_200 * fVar130;
    auVar56._8_4_ = (float)uStack_1f8 * fVar141;
    auVar56._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar124;
    auVar56._16_4_ = (float)uStack_1f0 * 0.0;
    auVar56._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar56._24_4_ = (float)uStack_1e8 * 0.0;
    auVar56._28_4_ = DAT_01f7b040._28_4_;
    auVar98 = vfmadd231ps_fma(auVar168,auVar85,local_3c0);
    auVar146 = vfmadd231ps_fma(auVar182,auVar85,auVar179);
    auVar172 = vfmadd231ps_fma(auVar11,auVar85,auVar246._0_32_);
    auVar69 = vfmadd231ps_fma(auVar56,auVar85,auVar259._0_32_);
    auVar260._0_4_ = fVar130 * local_2c0;
    auVar260._4_4_ = fVar95 * fStack_2bc;
    auVar260._8_4_ = fVar141 * fStack_2b8;
    auVar260._12_4_ = fVar124 * fStack_2b4;
    auVar260._16_4_ = fStack_2b0 * 0.0;
    auVar260._20_4_ = fStack_2ac * 0.0;
    auVar260._28_36_ = auVar259._28_36_;
    auVar260._24_4_ = fStack_2a8 * 0.0;
    auVar233._0_4_ = fVar130 * (float)local_220;
    auVar233._4_4_ = fVar95 * local_220._4_4_;
    auVar233._8_4_ = fVar141 * (float)uStack_218;
    auVar233._12_4_ = fVar124 * uStack_218._4_4_;
    auVar233._16_4_ = (float)uStack_210 * 0.0;
    auVar233._20_4_ = uStack_210._4_4_ * 0.0;
    auVar233._28_36_ = auVar246._28_36_;
    auVar233._24_4_ = (float)uStack_208 * 0.0;
    auVar228._28_4_ = local_3c0._28_4_;
    auVar228._0_28_ =
         ZEXT1628(CONCAT412(auVar98._12_4_ * fVar124,
                            CONCAT48(auVar98._8_4_ * fVar141,
                                     CONCAT44(auVar98._4_4_ * fVar95,auVar98._0_4_ * fVar130))));
    auVar77 = vfmadd231ps_fma(auVar228,auVar85,ZEXT1632(auVar77));
    auVar80 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar124 * auVar146._12_4_,
                                                 CONCAT48(fVar141 * auVar146._8_4_,
                                                          CONCAT44(fVar95 * auVar146._4_4_,
                                                                   fVar130 * auVar146._0_4_)))),
                              auVar85,ZEXT1632(auVar80));
    auVar97 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar124 * auVar172._12_4_,
                                                 CONCAT48(fVar141 * auVar172._8_4_,
                                                          CONCAT44(fVar95 * auVar172._4_4_,
                                                                   fVar130 * auVar172._0_4_)))),
                              auVar85,ZEXT1632(auVar97));
    auVar74 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar124 * auVar69._12_4_,
                                                 CONCAT48(fVar141 * auVar69._8_4_,
                                                          CONCAT44(fVar95 * auVar69._4_4_,
                                                                   fVar130 * auVar69._0_4_)))),
                              auVar85,ZEXT1632(auVar74));
    auVar206._4_4_ = fVar95 * local_240._4_4_;
    auVar206._0_4_ = fVar130 * (float)local_240;
    auVar206._8_4_ = fVar141 * (float)uStack_238;
    auVar206._12_4_ = fVar124 * uStack_238._4_4_;
    auVar206._16_4_ = (float)uStack_230 * 0.0;
    auVar206._20_4_ = uStack_230._4_4_ * 0.0;
    auVar206._24_4_ = (float)uStack_228 * 0.0;
    auVar206._28_4_ = auVar179._28_4_;
    auVar96 = vfmadd231ps_fma(auVar260._0_32_,auVar85,auVar52);
    auVar98 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar96._12_4_ * fVar124,
                                                 CONCAT48(auVar96._8_4_ * fVar141,
                                                          CONCAT44(auVar96._4_4_ * fVar95,
                                                                   auVar96._0_4_ * fVar130)))),
                              auVar85,ZEXT1632(auVar98));
    auVar226._0_4_ = fVar130 * (float)local_260;
    auVar226._4_4_ = fVar95 * local_260._4_4_;
    auVar226._8_4_ = fVar141 * (float)uStack_258;
    auVar226._12_4_ = fVar124 * uStack_258._4_4_;
    auVar226._16_4_ = (float)uStack_250 * 0.0;
    auVar226._20_4_ = uStack_250._4_4_ * 0.0;
    auVar226._24_4_ = (float)uStack_248 * 0.0;
    auVar226._28_4_ = 0;
    auVar96 = vfmadd231ps_fma(auVar233._0_32_,auVar85,local_500);
    auVar171 = vfmadd231ps_fma(auVar206,auVar85,auVar267);
    auVar184 = vfmadd231ps_fma(auVar226,auVar85,auVar53);
    auVar161._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    auVar161._0_28_ =
         ZEXT1628(CONCAT412(auVar184._12_4_ * fVar124,
                            CONCAT48(auVar184._8_4_ * fVar141,
                                     CONCAT44(auVar184._4_4_ * fVar95,auVar184._0_4_ * fVar130))));
    auVar146 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar96._12_4_ * fVar124,
                                                  CONCAT48(auVar96._8_4_ * fVar141,
                                                           CONCAT44(auVar96._4_4_ * fVar95,
                                                                    auVar96._0_4_ * fVar130)))),
                               auVar85,ZEXT1632(auVar146));
    auVar172 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar124 * auVar171._12_4_,
                                                  CONCAT48(fVar141 * auVar171._8_4_,
                                                           CONCAT44(fVar95 * auVar171._4_4_,
                                                                    fVar130 * auVar171._0_4_)))),
                               auVar85,ZEXT1632(auVar172));
    auVar69 = vfmadd231ps_fma(auVar161,auVar85,ZEXT1632(auVar69));
    auVar57._28_4_ = fVar143;
    auVar57._0_28_ =
         ZEXT1628(CONCAT412(fVar124 * auVar172._12_4_,
                            CONCAT48(fVar141 * auVar172._8_4_,
                                     CONCAT44(fVar95 * auVar172._4_4_,fVar130 * auVar172._0_4_))));
    auVar240._28_4_ = fStack_284;
    auVar240._0_28_ =
         ZEXT1628(CONCAT412(auVar69._12_4_ * fVar124,
                            CONCAT48(auVar69._8_4_ * fVar141,
                                     CONCAT44(auVar69._4_4_ * fVar95,auVar69._0_4_ * fVar130))));
    auVar96 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar98._12_4_ * fVar124,
                                                 CONCAT48(auVar98._8_4_ * fVar141,
                                                          CONCAT44(auVar98._4_4_ * fVar95,
                                                                   auVar98._0_4_ * fVar130)))),
                              auVar85,ZEXT1632(auVar77));
    auVar171 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar146._12_4_ * fVar124,
                                                  CONCAT48(auVar146._8_4_ * fVar141,
                                                           CONCAT44(auVar146._4_4_ * fVar95,
                                                                    auVar146._0_4_ * fVar130)))),
                               auVar85,ZEXT1632(auVar80));
    auVar184 = vfmadd231ps_fma(auVar57,auVar85,ZEXT1632(auVar97));
    auVar185 = vfmadd231ps_fma(auVar240,ZEXT1632(auVar74),auVar85);
    auVar218 = vsubps_avx(ZEXT1632(auVar98),ZEXT1632(auVar77));
    auVar85 = vsubps_avx(ZEXT1632(auVar146),ZEXT1632(auVar80));
    auVar179 = vsubps_avx(ZEXT1632(auVar172),ZEXT1632(auVar97));
    auVar204 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar74));
    local_780._0_4_ = fVar129 * auVar218._0_4_ * 3.0;
    local_780._4_4_ = fVar129 * auVar218._4_4_ * 3.0;
    local_780._8_4_ = fVar129 * auVar218._8_4_ * 3.0;
    local_780._12_4_ = fVar129 * auVar218._12_4_ * 3.0;
    local_780._16_4_ = fVar129 * auVar218._16_4_ * 3.0;
    local_780._20_4_ = fVar129 * auVar218._20_4_ * 3.0;
    local_780._24_4_ = fVar129 * auVar218._24_4_ * 3.0;
    local_780._28_4_ = 0;
    fVar198 = fVar129 * auVar85._0_4_ * 3.0;
    fVar208 = fVar129 * auVar85._4_4_ * 3.0;
    local_aa0._4_4_ = fVar208;
    local_aa0._0_4_ = fVar198;
    fVar209 = fVar129 * auVar85._8_4_ * 3.0;
    local_aa0._8_4_ = fVar209;
    fVar210 = fVar129 * auVar85._12_4_ * 3.0;
    local_aa0._12_4_ = fVar210;
    fVar211 = fVar129 * auVar85._16_4_ * 3.0;
    local_aa0._16_4_ = fVar211;
    fVar212 = fVar129 * auVar85._20_4_ * 3.0;
    local_aa0._20_4_ = fVar212;
    fVar213 = fVar129 * auVar85._24_4_ * 3.0;
    local_aa0._24_4_ = fVar213;
    local_aa0._28_4_ = auVar179._28_4_;
    auVar236._0_4_ = fVar129 * auVar179._0_4_ * 3.0;
    auVar236._4_4_ = fVar129 * auVar179._4_4_ * 3.0;
    auVar236._8_4_ = fVar129 * auVar179._8_4_ * 3.0;
    auVar236._12_4_ = fVar129 * auVar179._12_4_ * 3.0;
    auVar236._16_4_ = fVar129 * auVar179._16_4_ * 3.0;
    auVar236._20_4_ = fVar129 * auVar179._20_4_ * 3.0;
    auVar236._24_4_ = fVar129 * auVar179._24_4_ * 3.0;
    auVar236._28_4_ = 0;
    fVar95 = fVar129 * auVar204._0_4_ * 3.0;
    fVar124 = fVar129 * auVar204._4_4_ * 3.0;
    auVar163._4_4_ = fVar124;
    auVar163._0_4_ = fVar95;
    fVar125 = fVar129 * auVar204._8_4_ * 3.0;
    auVar163._8_4_ = fVar125;
    fVar126 = fVar129 * auVar204._12_4_ * 3.0;
    auVar163._12_4_ = fVar126;
    fVar127 = fVar129 * auVar204._16_4_ * 3.0;
    auVar163._16_4_ = fVar127;
    fVar128 = fVar129 * auVar204._20_4_ * 3.0;
    auVar163._20_4_ = fVar128;
    fVar129 = fVar129 * auVar204._24_4_ * 3.0;
    auVar163._24_4_ = fVar129;
    auVar163._28_4_ = auVar218._28_4_;
    auVar161 = ZEXT1632(auVar96);
    auVar11 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar96));
    _local_940 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar171));
    local_a80 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar184));
    local_300 = vsubps_avx(auVar11,auVar161);
    local_2e0 = vsubps_avx(local_a80,ZEXT1632(auVar184));
    fVar130 = local_2e0._0_4_;
    fVar141 = local_2e0._4_4_;
    auVar269._4_4_ = local_780._4_4_ * fVar141;
    auVar269._0_4_ = local_780._0_4_ * fVar130;
    fVar142 = local_2e0._8_4_;
    auVar269._8_4_ = local_780._8_4_ * fVar142;
    fVar143 = local_2e0._12_4_;
    auVar269._12_4_ = local_780._12_4_ * fVar143;
    fVar145 = local_2e0._16_4_;
    auVar269._16_4_ = local_780._16_4_ * fVar145;
    fVar170 = local_2e0._20_4_;
    auVar269._20_4_ = local_780._20_4_ * fVar170;
    fVar144 = local_2e0._24_4_;
    auVar269._24_4_ = local_780._24_4_ * fVar144;
    auVar269._28_4_ = local_a80._28_4_;
    auVar77 = vfmsub231ps_fma(auVar269,auVar236,local_300);
    local_320 = vsubps_avx(_local_940,ZEXT1632(auVar171));
    fVar247 = local_300._0_4_;
    fVar248 = local_300._4_4_;
    auVar10._4_4_ = fVar248 * fVar208;
    auVar10._0_4_ = fVar247 * fVar198;
    fVar249 = local_300._8_4_;
    auVar10._8_4_ = fVar249 * fVar209;
    fVar251 = local_300._12_4_;
    auVar10._12_4_ = fVar251 * fVar210;
    fVar253 = local_300._16_4_;
    auVar10._16_4_ = fVar253 * fVar211;
    fVar250 = local_300._20_4_;
    auVar10._20_4_ = fVar250 * fVar212;
    fVar252 = local_300._24_4_;
    auVar10._24_4_ = fVar252 * fVar213;
    auVar10._28_4_ = auVar11._28_4_;
    auVar80 = vfmsub231ps_fma(auVar10,local_780,local_320);
    auVar77 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar80._12_4_ * auVar80._12_4_,
                                                 CONCAT48(auVar80._8_4_ * auVar80._8_4_,
                                                          CONCAT44(auVar80._4_4_ * auVar80._4_4_,
                                                                   auVar80._0_4_ * auVar80._0_4_))))
                              ,ZEXT1632(auVar77),ZEXT1632(auVar77));
    auVar162._0_4_ = fVar130 * fVar130;
    auVar162._4_4_ = fVar141 * fVar141;
    auVar162._8_4_ = fVar142 * fVar142;
    auVar162._12_4_ = fVar143 * fVar143;
    auVar162._16_4_ = fVar145 * fVar145;
    auVar162._20_4_ = fVar170 * fVar170;
    auVar162._24_4_ = fVar144 * fVar144;
    auVar162._28_4_ = 0;
    auVar80 = vfmadd231ps_fma(auVar162,local_320,local_320);
    auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),local_300,local_300);
    fVar198 = local_320._0_4_;
    fVar208 = local_320._4_4_;
    auVar14._4_4_ = fVar208 * auVar236._4_4_;
    auVar14._0_4_ = fVar198 * auVar236._0_4_;
    fVar209 = local_320._8_4_;
    auVar14._8_4_ = fVar209 * auVar236._8_4_;
    fVar210 = local_320._12_4_;
    auVar14._12_4_ = fVar210 * auVar236._12_4_;
    fVar211 = local_320._16_4_;
    auVar14._16_4_ = fVar211 * auVar236._16_4_;
    fVar212 = local_320._20_4_;
    auVar14._20_4_ = fVar212 * auVar236._20_4_;
    fVar213 = local_320._24_4_;
    auVar14._24_4_ = fVar213 * auVar236._24_4_;
    auVar14._28_4_ = local_940._28_4_;
    auVar85 = vrcpps_avx(ZEXT1632(auVar80));
    auVar97 = vfmsub231ps_fma(auVar14,local_aa0,local_2e0);
    auVar97 = vfmadd231ps_fma(ZEXT1632(auVar77),ZEXT1632(auVar97),ZEXT1632(auVar97));
    auVar263._8_4_ = 0x3f800000;
    auVar263._0_8_ = 0x3f8000003f800000;
    auVar263._12_4_ = 0x3f800000;
    auVar263._16_4_ = 0x3f800000;
    auVar263._20_4_ = 0x3f800000;
    auVar263._24_4_ = 0x3f800000;
    auVar263._28_4_ = 0x3f800000;
    auVar77 = vfnmadd213ps_fma(auVar85,ZEXT1632(auVar80),auVar263);
    auVar77 = vfmadd132ps_fma(ZEXT1632(auVar77),auVar85,auVar85);
    local_9c0 = vpermps_avx2(_DAT_01fb7720,local_780);
    local_a00 = vpermps_avx2(_DAT_01fb7720,auVar236);
    auVar15._4_4_ = local_9c0._4_4_ * fVar141;
    auVar15._0_4_ = local_9c0._0_4_ * fVar130;
    auVar15._8_4_ = local_9c0._8_4_ * fVar142;
    auVar15._12_4_ = local_9c0._12_4_ * fVar143;
    auVar15._16_4_ = local_9c0._16_4_ * fVar145;
    auVar15._20_4_ = local_9c0._20_4_ * fVar170;
    auVar15._24_4_ = local_9c0._24_4_ * fVar144;
    auVar15._28_4_ = auVar85._28_4_;
    auVar74 = vfmsub231ps_fma(auVar15,local_a00,local_300);
    local_a20 = vpermps_avx2(_DAT_01fb7720,local_aa0);
    auVar16._4_4_ = fVar248 * local_a20._4_4_;
    auVar16._0_4_ = fVar247 * local_a20._0_4_;
    auVar16._8_4_ = fVar249 * local_a20._8_4_;
    auVar16._12_4_ = fVar251 * local_a20._12_4_;
    auVar16._16_4_ = fVar253 * local_a20._16_4_;
    auVar16._20_4_ = fVar250 * local_a20._20_4_;
    auVar16._24_4_ = fVar252 * local_a20._24_4_;
    auVar16._28_4_ = auVar179._28_4_;
    auVar98 = vfmsub231ps_fma(auVar16,local_9c0,local_320);
    auVar74 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar98._12_4_ * auVar98._12_4_,
                                                 CONCAT48(auVar98._8_4_ * auVar98._8_4_,
                                                          CONCAT44(auVar98._4_4_ * auVar98._4_4_,
                                                                   auVar98._0_4_ * auVar98._0_4_))))
                              ,ZEXT1632(auVar74),ZEXT1632(auVar74));
    auVar193._0_4_ = fVar198 * local_a00._0_4_;
    auVar193._4_4_ = fVar208 * local_a00._4_4_;
    auVar193._8_4_ = fVar209 * local_a00._8_4_;
    auVar193._12_4_ = fVar210 * local_a00._12_4_;
    auVar193._16_4_ = fVar211 * local_a00._16_4_;
    auVar193._20_4_ = fVar212 * local_a00._20_4_;
    auVar193._24_4_ = fVar213 * local_a00._24_4_;
    auVar193._28_4_ = 0;
    auVar98 = vfmsub231ps_fma(auVar193,local_a20,local_2e0);
    auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),ZEXT1632(auVar98),ZEXT1632(auVar98));
    auVar85 = vmaxps_avx(ZEXT1632(CONCAT412(auVar97._12_4_ * auVar77._12_4_,
                                            CONCAT48(auVar97._8_4_ * auVar77._8_4_,
                                                     CONCAT44(auVar97._4_4_ * auVar77._4_4_,
                                                              auVar97._0_4_ * auVar77._0_4_)))),
                         ZEXT1632(CONCAT412(auVar74._12_4_ * auVar77._12_4_,
                                            CONCAT48(auVar74._8_4_ * auVar77._8_4_,
                                                     CONCAT44(auVar74._4_4_ * auVar77._4_4_,
                                                              auVar74._0_4_ * auVar77._0_4_)))));
    local_800._0_4_ = auVar185._0_4_ + fVar95;
    local_800._4_4_ = auVar185._4_4_ + fVar124;
    local_800._8_4_ = auVar185._8_4_ + fVar125;
    local_800._12_4_ = auVar185._12_4_ + fVar126;
    local_800._16_4_ = fVar127 + 0.0;
    local_800._20_4_ = fVar128 + 0.0;
    local_800._24_4_ = fVar129 + 0.0;
    local_800._28_4_ = auVar218._28_4_ + 0.0;
    local_7e0 = ZEXT1632(auVar185);
    auVar218 = vsubps_avx(local_7e0,auVar163);
    auVar228 = vpermps_avx2(_DAT_01fb7720,auVar218);
    auVar206 = vpermps_avx2(_DAT_01fb7720,local_7e0);
    auVar218 = vmaxps_avx(local_7e0,local_800);
    auVar204 = vrsqrtps_avx(ZEXT1632(auVar80));
    auVar179 = vmaxps_avx(auVar228,auVar206);
    auVar218 = vmaxps_avx(auVar218,auVar179);
    fVar95 = auVar204._0_4_;
    fVar124 = auVar204._4_4_;
    fVar129 = auVar204._8_4_;
    fVar125 = auVar204._12_4_;
    fVar126 = auVar204._16_4_;
    fVar127 = auVar204._20_4_;
    fVar128 = auVar204._24_4_;
    auVar55._4_4_ = fVar124 * fVar124 * fVar124 * auVar80._4_4_ * -0.5;
    auVar55._0_4_ = fVar95 * fVar95 * fVar95 * auVar80._0_4_ * -0.5;
    auVar55._8_4_ = fVar129 * fVar129 * fVar129 * auVar80._8_4_ * -0.5;
    auVar55._12_4_ = fVar125 * fVar125 * fVar125 * auVar80._12_4_ * -0.5;
    auVar55._16_4_ = fVar126 * fVar126 * fVar126 * -0.0;
    auVar55._20_4_ = fVar127 * fVar127 * fVar127 * -0.0;
    auVar55._24_4_ = fVar128 * fVar128 * fVar128 * -0.0;
    auVar55._28_4_ = DAT_01fb7720._28_4_;
    auVar112._8_4_ = 0x3fc00000;
    auVar112._0_8_ = 0x3fc000003fc00000;
    auVar112._12_4_ = 0x3fc00000;
    auVar112._16_4_ = 0x3fc00000;
    auVar112._20_4_ = 0x3fc00000;
    auVar112._24_4_ = 0x3fc00000;
    auVar112._28_4_ = 0x3fc00000;
    auVar77 = vfmadd231ps_fma(auVar55,auVar112,auVar204);
    auVar233 = ZEXT1664(auVar77);
    fVar95 = auVar77._0_4_;
    fVar124 = auVar77._4_4_;
    auVar17._4_4_ = fVar208 * fVar124;
    auVar17._0_4_ = fVar198 * fVar95;
    fVar129 = auVar77._8_4_;
    auVar17._8_4_ = fVar209 * fVar129;
    fVar125 = auVar77._12_4_;
    auVar17._12_4_ = fVar210 * fVar125;
    auVar17._16_4_ = fVar211 * 0.0;
    auVar17._20_4_ = fVar212 * 0.0;
    auVar17._24_4_ = fVar213 * 0.0;
    auVar17._28_4_ = 0;
    auVar18._4_4_ = (float)local_8a0._4_4_ * fVar124 * fVar141;
    auVar18._0_4_ = (float)local_8a0._0_4_ * fVar95 * fVar130;
    auVar18._8_4_ = fStack_898 * fVar129 * fVar142;
    auVar18._12_4_ = fStack_894 * fVar125 * fVar143;
    auVar18._16_4_ = fStack_890 * fVar145 * 0.0;
    auVar18._20_4_ = fStack_88c * fVar170 * 0.0;
    auVar18._24_4_ = fStack_888 * fVar144 * 0.0;
    auVar18._28_4_ = local_320._28_4_;
    auVar80 = vfmadd231ps_fma(auVar18,auVar17,_local_640);
    local_600 = ZEXT1632(auVar184);
    auVar204 = vsubps_avx(ZEXT832(0) << 0x20,local_600);
    fVar126 = auVar204._0_4_;
    auVar268._0_4_ = fVar126 * fVar95 * fVar130;
    fVar127 = auVar204._4_4_;
    auVar268._4_4_ = fVar127 * fVar124 * fVar141;
    fVar128 = auVar204._8_4_;
    auVar268._8_4_ = fVar128 * fVar129 * fVar142;
    fVar198 = auVar204._12_4_;
    auVar268._12_4_ = fVar198 * fVar125 * fVar143;
    fVar208 = auVar204._16_4_;
    auVar268._16_4_ = fVar208 * fVar145 * 0.0;
    fVar145 = auVar204._20_4_;
    auVar268._20_4_ = fVar145 * fVar170 * 0.0;
    fVar170 = auVar204._24_4_;
    auVar268._24_4_ = fVar170 * fVar144 * 0.0;
    auVar268._28_4_ = 0;
    local_620 = ZEXT1632(auVar171);
    auVar165 = vsubps_avx(ZEXT832(0) << 0x20,local_620);
    auVar97 = vfmadd231ps_fma(auVar268,auVar165,auVar17);
    auVar19._4_4_ = fVar248 * fVar124;
    auVar19._0_4_ = fVar247 * fVar95;
    auVar19._8_4_ = fVar249 * fVar129;
    auVar19._12_4_ = fVar251 * fVar125;
    auVar19._16_4_ = fVar253 * 0.0;
    auVar19._20_4_ = fVar250 * 0.0;
    auVar19._24_4_ = fVar252 * 0.0;
    auVar19._28_4_ = auVar179._28_4_;
    auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar19,_local_660);
    auVar243 = ZEXT1664(auVar80);
    auVar163 = ZEXT832(0) << 0x20;
    auVar168 = vsubps_avx(auVar163,auVar161);
    auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar168,auVar19);
    auVar20._4_4_ = (float)local_8a0._4_4_ * fVar127;
    auVar20._0_4_ = (float)local_8a0._0_4_ * fVar126;
    auVar20._8_4_ = fStack_898 * fVar128;
    auVar20._12_4_ = fStack_894 * fVar198;
    auVar20._16_4_ = fStack_890 * fVar208;
    auVar20._20_4_ = fStack_88c * fVar145;
    auVar20._24_4_ = fStack_888 * fVar170;
    auVar20._28_4_ = auVar179._28_4_;
    auVar74 = vfmadd231ps_fma(auVar20,_local_640,auVar165);
    auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),_local_660,auVar168);
    fVar130 = auVar97._0_4_;
    fVar211 = auVar80._0_4_;
    fVar141 = auVar97._4_4_;
    fVar212 = auVar80._4_4_;
    fVar142 = auVar97._8_4_;
    fVar213 = auVar80._8_4_;
    fVar143 = auVar97._12_4_;
    fVar247 = auVar80._12_4_;
    auVar21._28_4_ = local_640._28_4_;
    auVar21._0_28_ =
         ZEXT1628(CONCAT412(fVar247 * fVar143,
                            CONCAT48(fVar213 * fVar142,CONCAT44(fVar212 * fVar141,fVar211 * fVar130)
                                    )));
    auVar179 = vsubps_avx(ZEXT1632(auVar74),auVar21);
    auVar22._4_4_ = fVar127 * fVar127;
    auVar22._0_4_ = fVar126 * fVar126;
    auVar22._8_4_ = fVar128 * fVar128;
    auVar22._12_4_ = fVar198 * fVar198;
    auVar22._16_4_ = fVar208 * fVar208;
    auVar22._20_4_ = fVar145 * fVar145;
    auVar22._24_4_ = fVar170 * fVar170;
    auVar22._28_4_ = local_640._28_4_;
    auVar74 = vfmadd231ps_fma(auVar22,auVar165,auVar165);
    auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar168,auVar168);
    auVar23._28_4_ = local_300._28_4_;
    auVar23._0_28_ =
         ZEXT1628(CONCAT412(fVar143 * fVar143,
                            CONCAT48(fVar142 * fVar142,CONCAT44(fVar141 * fVar141,fVar130 * fVar130)
                                    )));
    auVar182 = vsubps_avx(ZEXT1632(auVar74),auVar23);
    local_5c0 = vsqrtps_avx(auVar85);
    fVar130 = (auVar218._0_4_ + local_5c0._0_4_) * 1.0000002;
    fVar141 = (auVar218._4_4_ + local_5c0._4_4_) * 1.0000002;
    fVar142 = (auVar218._8_4_ + local_5c0._8_4_) * 1.0000002;
    fVar143 = (auVar218._12_4_ + local_5c0._12_4_) * 1.0000002;
    fVar144 = (auVar218._16_4_ + local_5c0._16_4_) * 1.0000002;
    fVar209 = (auVar218._20_4_ + local_5c0._20_4_) * 1.0000002;
    fVar210 = (auVar218._24_4_ + local_5c0._24_4_) * 1.0000002;
    auVar24._4_4_ = fVar141 * fVar141;
    auVar24._0_4_ = fVar130 * fVar130;
    auVar24._8_4_ = fVar142 * fVar142;
    auVar24._12_4_ = fVar143 * fVar143;
    auVar24._16_4_ = fVar144 * fVar144;
    auVar24._20_4_ = fVar209 * fVar209;
    auVar24._24_4_ = fVar210 * fVar210;
    auVar24._28_4_ = auVar218._28_4_ + local_5c0._28_4_;
    local_360._0_4_ = auVar179._0_4_ + auVar179._0_4_;
    local_360._4_4_ = auVar179._4_4_ + auVar179._4_4_;
    local_360._8_4_ = auVar179._8_4_ + auVar179._8_4_;
    local_360._12_4_ = auVar179._12_4_ + auVar179._12_4_;
    local_360._16_4_ = auVar179._16_4_ + auVar179._16_4_;
    local_360._20_4_ = auVar179._20_4_ + auVar179._20_4_;
    local_360._24_4_ = auVar179._24_4_ + auVar179._24_4_;
    fVar130 = auVar179._28_4_;
    local_360._28_4_ = fVar130 + fVar130;
    auVar179 = vsubps_avx(auVar182,auVar24);
    auVar240 = ZEXT1632(auVar80);
    local_340._28_4_ = auVar218._28_4_;
    local_340._0_28_ =
         ZEXT1628(CONCAT412(fVar247 * fVar247,
                            CONCAT48(fVar213 * fVar213,CONCAT44(fVar212 * fVar212,fVar211 * fVar211)
                                    )));
    local_ac0 = vsubps_avx(local_280,local_340);
    auVar25._4_4_ = local_360._4_4_ * local_360._4_4_;
    auVar25._0_4_ = local_360._0_4_ * local_360._0_4_;
    auVar25._8_4_ = local_360._8_4_ * local_360._8_4_;
    auVar25._12_4_ = local_360._12_4_ * local_360._12_4_;
    auVar25._16_4_ = local_360._16_4_ * local_360._16_4_;
    auVar25._20_4_ = local_360._20_4_ * local_360._20_4_;
    auVar25._24_4_ = local_360._24_4_ * local_360._24_4_;
    auVar25._28_4_ = fVar130;
    fVar130 = local_ac0._0_4_;
    local_5e0._0_4_ = fVar130 * 4.0;
    fVar141 = local_ac0._4_4_;
    local_5e0._4_4_ = fVar141 * 4.0;
    fVar142 = local_ac0._8_4_;
    fStack_5d8 = fVar142 * 4.0;
    fVar143 = local_ac0._12_4_;
    fStack_5d4 = fVar143 * 4.0;
    fVar144 = local_ac0._16_4_;
    fStack_5d0 = fVar144 * 4.0;
    fVar209 = local_ac0._20_4_;
    fStack_5cc = fVar209 * 4.0;
    fVar210 = local_ac0._24_4_;
    fStack_5c8 = fVar210 * 4.0;
    uStack_5c4 = 0x40800000;
    auVar26._4_4_ = (float)local_5e0._4_4_ * auVar179._4_4_;
    auVar26._0_4_ = (float)local_5e0._0_4_ * auVar179._0_4_;
    auVar26._8_4_ = fStack_5d8 * auVar179._8_4_;
    auVar26._12_4_ = fStack_5d4 * auVar179._12_4_;
    auVar26._16_4_ = fStack_5d0 * auVar179._16_4_;
    auVar26._20_4_ = fStack_5cc * auVar179._20_4_;
    auVar26._24_4_ = fStack_5c8 * auVar179._24_4_;
    auVar26._28_4_ = 0x40800000;
    auVar218 = vsubps_avx(auVar25,auVar26);
    auVar85 = vcmpps_avx(auVar218,auVar163,5);
    local_6a0._8_4_ = 0x80000000;
    local_6a0._0_8_ = 0x8000000080000000;
    local_6a0._12_4_ = 0x80000000;
    local_6a0._16_4_ = 0x80000000;
    local_6a0._20_4_ = 0x80000000;
    local_6a0._24_4_ = 0x80000000;
    local_6a0._28_4_ = 0x80000000;
    local_380._0_4_ = fVar130 + fVar130;
    local_380._4_4_ = fVar141 + fVar141;
    local_380._8_4_ = fVar142 + fVar142;
    local_380._12_4_ = fVar143 + fVar143;
    local_380._16_4_ = fVar144 + fVar144;
    local_380._20_4_ = fVar209 + fVar209;
    local_380._24_4_ = fVar210 + fVar210;
    local_380._28_4_ = local_ac0._28_4_ + local_ac0._28_4_;
    auVar269 = ZEXT1632(auVar97);
    if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar85 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar85 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar85 >> 0x7f,0) == '\0') &&
          (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar85 >> 0xbf,0) == '\0') &&
        (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar85[0x1f]) {
      auVar256._8_4_ = 0x7f800000;
      auVar256._0_8_ = 0x7f8000007f800000;
      auVar256._12_4_ = 0x7f800000;
      auVar256._16_4_ = 0x7f800000;
      auVar256._20_4_ = 0x7f800000;
      auVar256._24_4_ = 0x7f800000;
      auVar256._28_4_ = 0x7f800000;
      auVar227._8_4_ = 0xff800000;
      auVar227._0_8_ = 0xff800000ff800000;
      auVar227._12_4_ = 0xff800000;
      auVar227._16_4_ = 0xff800000;
      auVar227._20_4_ = 0xff800000;
      auVar227._24_4_ = 0xff800000;
      auVar227._28_4_ = 0xff800000;
      auVar246 = ZEXT3264(CONCAT824(uStack_948,CONCAT816(uStack_950,CONCAT88(uStack_958,local_960)))
                         );
      auVar238 = ZEXT3264(auVar85);
    }
    else {
      auVar10 = vsqrtps_avx(auVar218);
      auVar163 = vcmpps_avx(auVar218,auVar163,5);
      auVar218 = vrcpps_avx(local_380);
      auVar219._8_4_ = 0x3f800000;
      auVar219._0_8_ = 0x3f8000003f800000;
      auVar219._12_4_ = 0x3f800000;
      auVar219._16_4_ = 0x3f800000;
      auVar219._20_4_ = 0x3f800000;
      auVar219._24_4_ = 0x3f800000;
      auVar219._28_4_ = 0x3f800000;
      auVar80 = vfnmadd213ps_fma(auVar218,local_380,auVar219);
      auVar80 = vfmadd132ps_fma(ZEXT1632(auVar80),auVar218,auVar218);
      uVar13 = CONCAT44(local_360._4_4_,local_360._0_4_);
      auVar264._0_8_ = uVar13 ^ 0x8000000080000000;
      auVar264._8_4_ = -local_360._8_4_;
      auVar264._12_4_ = -local_360._12_4_;
      auVar264._16_4_ = -local_360._16_4_;
      auVar264._20_4_ = -local_360._20_4_;
      auVar264._24_4_ = -local_360._24_4_;
      auVar264._28_4_ = -local_360._28_4_;
      auVar218 = vsubps_avx(auVar264,auVar10);
      auVar27._4_4_ = auVar218._4_4_ * auVar80._4_4_;
      auVar27._0_4_ = auVar218._0_4_ * auVar80._0_4_;
      auVar27._8_4_ = auVar218._8_4_ * auVar80._8_4_;
      auVar27._12_4_ = auVar218._12_4_ * auVar80._12_4_;
      auVar27._16_4_ = auVar218._16_4_ * 0.0;
      auVar27._20_4_ = auVar218._20_4_ * 0.0;
      auVar27._24_4_ = auVar218._24_4_ * 0.0;
      auVar27._28_4_ = auVar218._28_4_;
      auVar218 = vsubps_avx(auVar10,local_360);
      auVar245._0_4_ = auVar80._0_4_ * auVar218._0_4_;
      auVar245._4_4_ = auVar80._4_4_ * auVar218._4_4_;
      auVar245._8_4_ = auVar80._8_4_ * auVar218._8_4_;
      auVar245._12_4_ = auVar80._12_4_ * auVar218._12_4_;
      auVar245._16_4_ = auVar218._16_4_ * 0.0;
      auVar245._20_4_ = auVar218._20_4_ * 0.0;
      auVar245._24_4_ = auVar218._24_4_ * 0.0;
      auVar245._28_4_ = 0;
      auVar80 = vfmadd213ps_fma(auVar240,auVar27,auVar269);
      local_400 = ZEXT1632(CONCAT412(fVar125 * auVar80._12_4_,
                                     CONCAT48(fVar129 * auVar80._8_4_,
                                              CONCAT44(fVar124 * auVar80._4_4_,
                                                       fVar95 * auVar80._0_4_))));
      auVar218 = vandps_avx(local_340,local_680);
      auVar218 = vmaxps_avx(local_580,auVar218);
      auVar28._4_4_ = auVar218._4_4_ * 1.9073486e-06;
      auVar28._0_4_ = auVar218._0_4_ * 1.9073486e-06;
      auVar28._8_4_ = auVar218._8_4_ * 1.9073486e-06;
      auVar28._12_4_ = auVar218._12_4_ * 1.9073486e-06;
      auVar28._16_4_ = auVar218._16_4_ * 1.9073486e-06;
      auVar28._20_4_ = auVar218._20_4_ * 1.9073486e-06;
      auVar28._24_4_ = auVar218._24_4_ * 1.9073486e-06;
      auVar28._28_4_ = auVar218._28_4_;
      auVar218 = vandps_avx(local_680,local_ac0);
      auVar218 = vcmpps_avx(auVar218,auVar28,1);
      auVar80 = vfmadd213ps_fma(auVar240,auVar245,auVar269);
      auVar220._8_4_ = 0x7f800000;
      auVar220._0_8_ = 0x7f8000007f800000;
      auVar220._12_4_ = 0x7f800000;
      auVar220._16_4_ = 0x7f800000;
      auVar220._20_4_ = 0x7f800000;
      auVar220._24_4_ = 0x7f800000;
      auVar220._28_4_ = 0x7f800000;
      auVar256 = vblendvps_avx(auVar220,auVar27,auVar163);
      local_420 = fVar95 * auVar80._0_4_;
      fStack_41c = fVar124 * auVar80._4_4_;
      fStack_418 = fVar129 * auVar80._8_4_;
      fStack_414 = fVar125 * auVar80._12_4_;
      uStack_410 = 0;
      uStack_40c = 0;
      uStack_408 = 0;
      uStack_404 = auVar256._28_4_;
      auVar257._8_4_ = 0xff800000;
      auVar257._0_8_ = 0xff800000ff800000;
      auVar257._12_4_ = 0xff800000;
      auVar257._16_4_ = 0xff800000;
      auVar257._20_4_ = 0xff800000;
      auVar257._24_4_ = 0xff800000;
      auVar257._28_4_ = 0xff800000;
      auVar227 = vblendvps_avx(auVar257,auVar245,auVar163);
      auVar10 = auVar163 & auVar218;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar10 >> 0x7f,0) == '\0') &&
            (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar10 >> 0xbf,0) == '\0') &&
          (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar10[0x1f])
      {
        auVar246 = ZEXT3264(CONCAT824(uStack_948,
                                      CONCAT816(uStack_950,CONCAT88(uStack_958,local_960))));
        auVar238 = ZEXT3264(auVar85);
      }
      else {
        auVar85 = vandps_avx(auVar218,auVar163);
        auVar179 = vcmpps_avx(auVar179,_DAT_01f7b000,2);
        auVar266._8_4_ = 0xff800000;
        auVar266._0_8_ = 0xff800000ff800000;
        auVar266._12_4_ = 0xff800000;
        auVar266._16_4_ = 0xff800000;
        auVar266._20_4_ = 0xff800000;
        auVar266._24_4_ = 0xff800000;
        auVar266._28_4_ = 0xff800000;
        auVar224._8_4_ = 0x7f800000;
        auVar224._0_8_ = 0x7f8000007f800000;
        auVar224._12_4_ = 0x7f800000;
        auVar224._16_4_ = 0x7f800000;
        auVar224._20_4_ = 0x7f800000;
        auVar224._24_4_ = 0x7f800000;
        auVar224._28_4_ = 0x7f800000;
        auVar218 = vblendvps_avx(auVar224,auVar266,auVar179);
        auVar80 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
        auVar10 = vpmovsxwd_avx2(auVar80);
        auVar256 = vblendvps_avx(auVar256,auVar218,auVar10);
        auVar218 = vblendvps_avx(auVar266,auVar224,auVar179);
        auVar227 = vblendvps_avx(auVar227,auVar218,auVar10);
        auVar139._0_8_ = auVar85._0_8_ ^ 0xffffffffffffffff;
        auVar139._8_4_ = auVar85._8_4_ ^ 0xffffffff;
        auVar139._12_4_ = auVar85._12_4_ ^ 0xffffffff;
        auVar139._16_4_ = auVar85._16_4_ ^ 0xffffffff;
        auVar139._20_4_ = auVar85._20_4_ ^ 0xffffffff;
        auVar139._24_4_ = auVar85._24_4_ ^ 0xffffffff;
        auVar139._28_4_ = auVar85._28_4_ ^ 0xffffffff;
        auVar85 = vorps_avx(auVar179,auVar139);
        auVar85 = vandps_avx(auVar163,auVar85);
        auVar238 = ZEXT3264(auVar85);
        auVar246 = ZEXT3264(CONCAT824(uStack_948,
                                      CONCAT816(uStack_950,CONCAT88(uStack_958,local_960))));
      }
    }
    auVar218 = auVar238._0_32_;
    auVar85 = local_520 & auVar218;
    fVar130 = (float)local_8c0._0_4_;
    fVar141 = (float)local_8c0._4_4_;
    fVar142 = fStack_8b8;
    fVar143 = fStack_8b4;
    fVar144 = fStack_8b0;
    fVar209 = fStack_8ac;
    fVar210 = fStack_8a8;
    fVar211 = fStack_8a4;
    if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar85 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar85 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar85 >> 0x7f,0) == '\0') &&
          (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar85 >> 0xbf,0) == '\0') &&
        (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar85[0x1f]) {
LAB_010ec7a4:
      auVar207 = ZEXT3264(local_9e0);
      auVar259 = ZEXT3264(auVar255);
    }
    else {
      local_440 = ZEXT1632(auVar77);
      auVar233 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      fVar212 = *(float *)(ray + k * 4 + 0x80) - (float)local_910._0_4_;
      auVar194._4_4_ = fVar212;
      auVar194._0_4_ = fVar212;
      auVar194._8_4_ = fVar212;
      auVar194._12_4_ = fVar212;
      auVar194._16_4_ = fVar212;
      auVar194._20_4_ = fVar212;
      auVar194._24_4_ = fVar212;
      auVar194._28_4_ = fVar212;
      auVar163 = vminps_avx(auVar194,auVar227);
      auVar29._4_4_ = fVar127 * auVar236._4_4_;
      auVar29._0_4_ = fVar126 * auVar236._0_4_;
      auVar29._8_4_ = fVar128 * auVar236._8_4_;
      auVar29._12_4_ = fVar198 * auVar236._12_4_;
      auVar29._16_4_ = fVar208 * auVar236._16_4_;
      auVar29._20_4_ = fVar145 * auVar236._20_4_;
      auVar29._24_4_ = fVar170 * auVar236._24_4_;
      auVar29._28_4_ = auVar204._28_4_;
      auVar77 = vfmadd213ps_fma(auVar165,local_aa0,auVar29);
      auVar51._4_4_ = fStack_3dc;
      auVar51._0_4_ = local_3e0;
      auVar51._8_4_ = fStack_3d8;
      auVar51._12_4_ = fStack_3d4;
      auVar51._16_4_ = fStack_3d0;
      auVar51._20_4_ = fStack_3cc;
      auVar51._24_4_ = fStack_3c8;
      auVar51._28_4_ = fStack_3c4;
      auVar204 = vmaxps_avx(auVar51,auVar256);
      auVar80 = vfmadd213ps_fma(auVar168,local_780,ZEXT1632(auVar77));
      auVar30._4_4_ = (float)local_8a0._4_4_ * auVar236._4_4_;
      auVar30._0_4_ = (float)local_8a0._0_4_ * auVar236._0_4_;
      auVar30._8_4_ = fStack_898 * auVar236._8_4_;
      auVar30._12_4_ = fStack_894 * auVar236._12_4_;
      auVar30._16_4_ = fStack_890 * auVar236._16_4_;
      auVar30._20_4_ = fStack_88c * auVar236._20_4_;
      auVar30._24_4_ = fStack_888 * auVar236._24_4_;
      auVar30._28_4_ = 0;
      auVar238 = ZEXT3264(_local_640);
      auVar77 = vfmadd231ps_fma(auVar30,_local_640,local_aa0);
      auVar97 = vfmadd231ps_fma(ZEXT1632(auVar77),_local_660,local_780);
      auVar85 = vandps_avx(ZEXT1632(auVar97),local_680);
      auVar221._8_4_ = 0x219392ef;
      auVar221._0_8_ = 0x219392ef219392ef;
      auVar221._12_4_ = 0x219392ef;
      auVar221._16_4_ = 0x219392ef;
      auVar221._20_4_ = 0x219392ef;
      auVar221._24_4_ = 0x219392ef;
      auVar221._28_4_ = 0x219392ef;
      auVar179 = vcmpps_avx(auVar85,auVar221,1);
      auVar85 = vrcpps_avx(ZEXT1632(auVar97));
      auVar258._8_4_ = 0x3f800000;
      auVar258._0_8_ = 0x3f8000003f800000;
      auVar258._12_4_ = 0x3f800000;
      auVar258._16_4_ = 0x3f800000;
      auVar258._20_4_ = 0x3f800000;
      auVar258._24_4_ = 0x3f800000;
      auVar258._28_4_ = 0x3f800000;
      auVar165 = ZEXT1632(auVar97);
      auVar77 = vfnmadd213ps_fma(auVar85,auVar165,auVar258);
      auVar77 = vfmadd132ps_fma(ZEXT1632(auVar77),auVar85,auVar85);
      auVar203._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
      auVar203._8_4_ = auVar97._8_4_ ^ 0x80000000;
      auVar203._12_4_ = auVar97._12_4_ ^ 0x80000000;
      auVar203._16_4_ = 0x80000000;
      auVar203._20_4_ = 0x80000000;
      auVar203._24_4_ = 0x80000000;
      auVar203._28_4_ = 0x80000000;
      auVar31._4_4_ = auVar77._4_4_ * -auVar80._4_4_;
      auVar31._0_4_ = auVar77._0_4_ * -auVar80._0_4_;
      auVar31._8_4_ = auVar77._8_4_ * -auVar80._8_4_;
      auVar31._12_4_ = auVar77._12_4_ * -auVar80._12_4_;
      auVar31._16_4_ = 0x80000000;
      auVar31._20_4_ = 0x80000000;
      auVar31._24_4_ = 0x80000000;
      auVar31._28_4_ = 0x80000000;
      auVar85 = vcmpps_avx(auVar165,auVar203,1);
      auVar85 = vorps_avx(auVar85,auVar179);
      auVar265._8_4_ = 0xff800000;
      auVar265._0_8_ = 0xff800000ff800000;
      auVar265._12_4_ = 0xff800000;
      auVar265._16_4_ = 0xff800000;
      auVar265._20_4_ = 0xff800000;
      auVar265._24_4_ = 0xff800000;
      auVar265._28_4_ = 0xff800000;
      auVar85 = vblendvps_avx(auVar31,auVar265,auVar85);
      auVar204 = vmaxps_avx(auVar204,auVar85);
      auVar85 = vcmpps_avx(auVar165,auVar203,6);
      auVar85 = vorps_avx(auVar179,auVar85);
      auVar180._8_4_ = 0x7f800000;
      auVar180._0_8_ = 0x7f8000007f800000;
      auVar180._12_4_ = 0x7f800000;
      auVar180._16_4_ = 0x7f800000;
      auVar180._20_4_ = 0x7f800000;
      auVar180._24_4_ = 0x7f800000;
      auVar180._28_4_ = 0x7f800000;
      auVar85 = vblendvps_avx(auVar31,auVar180,auVar85);
      auVar165 = vminps_avx(auVar163,auVar85);
      fVar145 = -local_a00._0_4_;
      fVar170 = -local_a00._4_4_;
      fVar126 = -local_a00._8_4_;
      fVar127 = -local_a00._12_4_;
      fVar128 = -local_a00._16_4_;
      fVar198 = -local_a00._20_4_;
      fVar208 = -local_a00._24_4_;
      auVar181._0_8_ = local_a20._0_8_ ^ 0x8000000080000000;
      auVar181._8_4_ = -local_a20._8_4_;
      auVar181._12_4_ = -local_a20._12_4_;
      auVar181._16_4_ = -local_a20._16_4_;
      auVar181._20_4_ = -local_a20._20_4_;
      auVar181._24_4_ = -local_a20._24_4_;
      auVar181._28_4_ = local_a20._28_4_ ^ 0x80000000;
      auVar85 = vsubps_avx(ZEXT832(0) << 0x20,_local_940);
      auVar179 = vsubps_avx(ZEXT832(0) << 0x20,local_a80);
      auVar32._4_4_ = auVar179._4_4_ * fVar170;
      auVar32._0_4_ = auVar179._0_4_ * fVar145;
      auVar32._8_4_ = auVar179._8_4_ * fVar126;
      auVar32._12_4_ = auVar179._12_4_ * fVar127;
      auVar32._16_4_ = auVar179._16_4_ * fVar128;
      auVar32._20_4_ = auVar179._20_4_ * fVar198;
      auVar32._24_4_ = auVar179._24_4_ * fVar208;
      auVar32._28_4_ = auVar179._28_4_;
      auVar77 = vfmadd231ps_fma(auVar32,auVar181,auVar85);
      auVar195._0_8_ = local_9c0._0_8_ ^ 0x8000000080000000;
      auVar195._8_4_ = -local_9c0._8_4_;
      auVar195._12_4_ = -local_9c0._12_4_;
      auVar195._16_4_ = -local_9c0._16_4_;
      auVar195._20_4_ = -local_9c0._20_4_;
      auVar195._24_4_ = -local_9c0._24_4_;
      auVar195._28_4_ = local_9c0._28_4_ ^ 0x80000000;
      auVar85 = vsubps_avx(ZEXT832(0) << 0x20,auVar11);
      auVar80 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar195,auVar85);
      auVar33._4_4_ = (float)local_8a0._4_4_ * fVar170;
      auVar33._0_4_ = (float)local_8a0._0_4_ * fVar145;
      auVar33._8_4_ = fStack_898 * fVar126;
      auVar33._12_4_ = fStack_894 * fVar127;
      auVar33._16_4_ = fStack_890 * fVar128;
      auVar33._20_4_ = fStack_88c * fVar198;
      auVar33._24_4_ = fStack_888 * fVar208;
      auVar33._28_4_ = local_a00._28_4_ ^ 0x80000000;
      auVar77 = vfmadd231ps_fma(auVar33,_local_640,auVar181);
      auVar97 = vfmadd231ps_fma(ZEXT1632(auVar77),_local_660,auVar195);
      auVar85 = vandps_avx(ZEXT1632(auVar97),local_680);
      auVar168 = vrcpps_avx(ZEXT1632(auVar97));
      auVar113._8_4_ = 0x219392ef;
      auVar113._0_8_ = 0x219392ef219392ef;
      auVar113._12_4_ = 0x219392ef;
      auVar113._16_4_ = 0x219392ef;
      auVar113._20_4_ = 0x219392ef;
      auVar113._24_4_ = 0x219392ef;
      auVar113._28_4_ = 0x219392ef;
      auVar179 = vcmpps_avx(auVar85,auVar113,1);
      auVar163 = ZEXT1632(auVar97);
      auVar77 = vfnmadd213ps_fma(auVar168,auVar163,auVar258);
      auVar77 = vfmadd132ps_fma(ZEXT1632(auVar77),auVar168,auVar168);
      auVar196._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
      auVar196._8_4_ = auVar97._8_4_ ^ 0x80000000;
      auVar196._12_4_ = auVar97._12_4_ ^ 0x80000000;
      auVar196._16_4_ = 0x80000000;
      auVar196._20_4_ = 0x80000000;
      auVar196._24_4_ = 0x80000000;
      auVar196._28_4_ = 0x80000000;
      auVar34._4_4_ = auVar77._4_4_ * -auVar80._4_4_;
      auVar34._0_4_ = auVar77._0_4_ * -auVar80._0_4_;
      auVar34._8_4_ = auVar77._8_4_ * -auVar80._8_4_;
      auVar34._12_4_ = auVar77._12_4_ * -auVar80._12_4_;
      auVar34._16_4_ = 0x80000000;
      auVar34._20_4_ = 0x80000000;
      auVar34._24_4_ = 0x80000000;
      auVar34._28_4_ = 0x80000000;
      auVar85 = vcmpps_avx(auVar163,auVar196,1);
      auVar85 = vorps_avx(auVar85,auVar179);
      auVar114._8_4_ = 0xff800000;
      auVar114._0_8_ = 0xff800000ff800000;
      auVar114._12_4_ = 0xff800000;
      auVar114._16_4_ = 0xff800000;
      auVar114._20_4_ = 0xff800000;
      auVar114._24_4_ = 0xff800000;
      auVar114._28_4_ = 0xff800000;
      auVar85 = vblendvps_avx(auVar34,auVar114,auVar85);
      local_a40 = vmaxps_avx(auVar204,auVar85);
      auVar85 = vcmpps_avx(auVar163,auVar196,6);
      auVar85 = vorps_avx(auVar179,auVar85);
      auVar135._8_4_ = 0x7f800000;
      auVar135._0_8_ = 0x7f8000007f800000;
      auVar135._12_4_ = 0x7f800000;
      auVar135._16_4_ = 0x7f800000;
      auVar135._20_4_ = 0x7f800000;
      auVar135._24_4_ = 0x7f800000;
      auVar135._28_4_ = 0x7f800000;
      auVar179 = vblendvps_avx(auVar34,auVar135,auVar85);
      auVar85 = vandps_avx(auVar218,local_520);
      local_460 = vminps_avx(auVar165,auVar179);
      auVar218 = vcmpps_avx(local_a40,local_460,2);
      auVar179 = auVar85 & auVar218;
      if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar179 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar179 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar179 >> 0x7f,0) == '\0') &&
            (auVar179 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar179 >> 0xbf,0) == '\0') &&
          (auVar179 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar179[0x1f]) {
        auVar246 = ZEXT3264(CONCAT824(uStack_948,
                                      CONCAT816(uStack_950,CONCAT88(uStack_958,local_960))));
        goto LAB_010ec7a4;
      }
      auVar205._8_4_ = 0x3f800000;
      auVar205._0_8_ = 0x3f8000003f800000;
      auVar205._12_4_ = 0x3f800000;
      auVar205._16_4_ = 0x3f800000;
      auVar205._20_4_ = 0x3f800000;
      auVar205._24_4_ = 0x3f800000;
      auVar205._28_4_ = 0x3f800000;
      auVar179 = vminps_avx(local_400,auVar205);
      auVar165 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar179 = vmaxps_avx(auVar179,ZEXT832(0) << 0x20);
      auVar50._4_4_ = fStack_41c;
      auVar50._0_4_ = local_420;
      auVar50._8_4_ = fStack_418;
      auVar50._12_4_ = fStack_414;
      auVar50._16_4_ = uStack_410;
      auVar50._20_4_ = uStack_40c;
      auVar50._24_4_ = uStack_408;
      auVar50._28_4_ = uStack_404;
      auVar204 = vminps_avx(auVar50,auVar205);
      auVar204 = vmaxps_avx(auVar204,ZEXT832(0) << 0x20);
      auVar35._4_4_ = (auVar179._4_4_ + 1.0) * 0.125;
      auVar35._0_4_ = (auVar179._0_4_ + 0.0) * 0.125;
      auVar35._8_4_ = (auVar179._8_4_ + 2.0) * 0.125;
      auVar35._12_4_ = (auVar179._12_4_ + 3.0) * 0.125;
      auVar35._16_4_ = (auVar179._16_4_ + 4.0) * 0.125;
      auVar35._20_4_ = (auVar179._20_4_ + 5.0) * 0.125;
      auVar35._24_4_ = (auVar179._24_4_ + 6.0) * 0.125;
      auVar35._28_4_ = auVar179._28_4_ + 7.0;
      auVar77 = vfmadd213ps_fma(auVar35,local_7c0,local_7a0);
      auVar36._4_4_ = (auVar204._4_4_ + 1.0) * 0.125;
      auVar36._0_4_ = (auVar204._0_4_ + 0.0) * 0.125;
      auVar36._8_4_ = (auVar204._8_4_ + 2.0) * 0.125;
      auVar36._12_4_ = (auVar204._12_4_ + 3.0) * 0.125;
      auVar36._16_4_ = (auVar204._16_4_ + 4.0) * 0.125;
      auVar36._20_4_ = (auVar204._20_4_ + 5.0) * 0.125;
      auVar36._24_4_ = (auVar204._24_4_ + 6.0) * 0.125;
      auVar36._28_4_ = auVar204._28_4_ + 7.0;
      auVar80 = vfmadd213ps_fma(auVar36,local_7c0,local_7a0);
      auVar179 = vminps_avx(local_7e0,local_800);
      auVar204 = vminps_avx(auVar228,auVar206);
      auVar179 = vminps_avx(auVar179,auVar204);
      auVar179 = vsubps_avx(auVar179,local_5c0);
      auVar85 = vandps_avx(auVar218,auVar85);
      local_1a0 = ZEXT1632(auVar77);
      local_1c0 = ZEXT1632(auVar80);
      auVar37._4_4_ = auVar179._4_4_ * 0.99999976;
      auVar37._0_4_ = auVar179._0_4_ * 0.99999976;
      auVar37._8_4_ = auVar179._8_4_ * 0.99999976;
      auVar37._12_4_ = auVar179._12_4_ * 0.99999976;
      auVar37._16_4_ = auVar179._16_4_ * 0.99999976;
      auVar37._20_4_ = auVar179._20_4_ * 0.99999976;
      auVar37._24_4_ = auVar179._24_4_ * 0.99999976;
      auVar37._28_4_ = auVar218._28_4_;
      auVar218 = vmaxps_avx(ZEXT832(0) << 0x20,auVar37);
      auVar38._4_4_ = auVar218._4_4_ * auVar218._4_4_;
      auVar38._0_4_ = auVar218._0_4_ * auVar218._0_4_;
      auVar38._8_4_ = auVar218._8_4_ * auVar218._8_4_;
      auVar38._12_4_ = auVar218._12_4_ * auVar218._12_4_;
      auVar38._16_4_ = auVar218._16_4_ * auVar218._16_4_;
      auVar38._20_4_ = auVar218._20_4_ * auVar218._20_4_;
      auVar38._24_4_ = auVar218._24_4_ * auVar218._24_4_;
      auVar38._28_4_ = auVar218._28_4_;
      auVar179 = vsubps_avx(auVar182,auVar38);
      auVar39._4_4_ = auVar179._4_4_ * (float)local_5e0._4_4_;
      auVar39._0_4_ = auVar179._0_4_ * (float)local_5e0._0_4_;
      auVar39._8_4_ = auVar179._8_4_ * fStack_5d8;
      auVar39._12_4_ = auVar179._12_4_ * fStack_5d4;
      auVar39._16_4_ = auVar179._16_4_ * fStack_5d0;
      auVar39._20_4_ = auVar179._20_4_ * fStack_5cc;
      auVar39._24_4_ = auVar179._24_4_ * fStack_5c8;
      auVar39._28_4_ = auVar218._28_4_;
      auVar204 = vsubps_avx(auVar25,auVar39);
      local_9a0 = vcmpps_avx(auVar204,ZEXT832(0) << 0x20,5);
      auVar218 = local_9a0;
      if ((((((((local_9a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_9a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_9a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_9a0 >> 0x7f,0) == '\0') &&
            (local_9a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_9a0 >> 0xbf,0) == '\0') &&
          (local_9a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_9a0[0x1f]) {
        auVar206 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar192 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar182 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar228 = ZEXT1232(ZEXT812(0)) << 0x20;
        _local_c00 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar222._8_4_ = 0x7f800000;
        auVar222._0_8_ = 0x7f8000007f800000;
        auVar222._12_4_ = 0x7f800000;
        auVar222._16_4_ = 0x7f800000;
        auVar222._20_4_ = 0x7f800000;
        auVar222._24_4_ = 0x7f800000;
        auVar222._28_4_ = 0x7f800000;
        auVar241._8_4_ = 0xff800000;
        auVar241._0_8_ = 0xff800000ff800000;
        auVar241._12_4_ = 0xff800000;
        auVar241._16_4_ = 0xff800000;
        auVar241._20_4_ = 0xff800000;
        auVar241._24_4_ = 0xff800000;
        auVar241._28_4_ = 0xff800000;
        local_9a0 = auVar11;
      }
      else {
        auVar165 = vrcpps_avx(local_380);
        auVar166._8_4_ = 0x3f800000;
        auVar166._0_8_ = 0x3f8000003f800000;
        auVar166._12_4_ = 0x3f800000;
        auVar166._16_4_ = 0x3f800000;
        auVar166._20_4_ = 0x3f800000;
        auVar166._24_4_ = 0x3f800000;
        auVar166._28_4_ = 0x3f800000;
        auVar77 = vfnmadd213ps_fma(local_380,auVar165,auVar166);
        auVar77 = vfmadd132ps_fma(ZEXT1632(auVar77),auVar165,auVar165);
        auVar165 = vsqrtps_avx(auVar204);
        uVar13 = CONCAT44(local_360._4_4_,local_360._0_4_);
        auVar167._0_8_ = uVar13 ^ 0x8000000080000000;
        auVar167._8_4_ = -local_360._8_4_;
        auVar167._12_4_ = -local_360._12_4_;
        auVar167._16_4_ = -local_360._16_4_;
        auVar167._20_4_ = -local_360._20_4_;
        auVar167._24_4_ = -local_360._24_4_;
        auVar167._28_4_ = -local_360._28_4_;
        auVar168 = vsubps_avx(auVar167,auVar165);
        auVar182 = vsubps_avx(auVar165,local_360);
        fVar145 = auVar168._0_4_ * auVar77._0_4_;
        fVar170 = auVar168._4_4_ * auVar77._4_4_;
        auVar40._4_4_ = fVar170;
        auVar40._0_4_ = fVar145;
        fVar126 = auVar168._8_4_ * auVar77._8_4_;
        auVar40._8_4_ = fVar126;
        fVar127 = auVar168._12_4_ * auVar77._12_4_;
        auVar40._12_4_ = fVar127;
        fVar128 = auVar168._16_4_ * 0.0;
        auVar40._16_4_ = fVar128;
        fVar198 = auVar168._20_4_ * 0.0;
        auVar40._20_4_ = fVar198;
        fVar208 = auVar168._24_4_ * 0.0;
        auVar40._24_4_ = fVar208;
        auVar40._28_4_ = auVar165._28_4_;
        fVar212 = auVar182._0_4_ * auVar77._0_4_;
        fVar213 = auVar182._4_4_ * auVar77._4_4_;
        auVar41._4_4_ = fVar213;
        auVar41._0_4_ = fVar212;
        fVar247 = auVar182._8_4_ * auVar77._8_4_;
        auVar41._8_4_ = fVar247;
        fVar248 = auVar182._12_4_ * auVar77._12_4_;
        auVar41._12_4_ = fVar248;
        fVar249 = auVar182._16_4_ * 0.0;
        auVar41._16_4_ = fVar249;
        fVar251 = auVar182._20_4_ * 0.0;
        auVar41._20_4_ = fVar251;
        fVar253 = auVar182._24_4_ * 0.0;
        auVar41._24_4_ = fVar253;
        auVar41._28_4_ = local_7a0._0_4_;
        auVar77 = vfmadd213ps_fma(auVar240,auVar40,auVar269);
        auVar80 = vfmadd213ps_fma(auVar240,auVar41,auVar269);
        auVar168 = ZEXT1632(CONCAT412(fVar125 * auVar77._12_4_,
                                      CONCAT48(fVar129 * auVar77._8_4_,
                                               CONCAT44(fVar124 * auVar77._4_4_,
                                                        fVar95 * auVar77._0_4_))));
        auVar165 = ZEXT1632(CONCAT412(auVar80._12_4_ * fVar125,
                                      CONCAT48(auVar80._8_4_ * fVar129,
                                               CONCAT44(auVar80._4_4_ * fVar124,
                                                        auVar80._0_4_ * fVar95))));
        auVar77 = vfmadd213ps_fma(local_300,auVar168,auVar161);
        auVar80 = vfmadd213ps_fma(local_300,auVar165,auVar161);
        auVar97 = vfmadd213ps_fma(local_320,auVar168,local_620);
        auVar74 = vfmadd213ps_fma(local_320,auVar165,local_620);
        auVar98 = vfmadd213ps_fma(auVar168,local_2e0,local_600);
        auVar146 = vfmadd213ps_fma(local_2e0,auVar165,local_600);
        auVar42._4_4_ = (float)local_660._4_4_ * fVar170;
        auVar42._0_4_ = (float)local_660._0_4_ * fVar145;
        auVar42._8_4_ = fStack_658 * fVar126;
        auVar42._12_4_ = fStack_654 * fVar127;
        auVar42._16_4_ = fStack_650 * fVar128;
        auVar42._20_4_ = fStack_64c * fVar198;
        auVar42._24_4_ = fStack_648 * fVar208;
        auVar42._28_4_ = 0;
        auVar182 = vsubps_avx(auVar42,ZEXT1632(auVar77));
        auVar197._0_4_ = (float)local_640._0_4_ * fVar145;
        auVar197._4_4_ = (float)local_640._4_4_ * fVar170;
        auVar197._8_4_ = fStack_638 * fVar126;
        auVar197._12_4_ = fStack_634 * fVar127;
        auVar197._16_4_ = fStack_630 * fVar128;
        auVar197._20_4_ = fStack_62c * fVar198;
        auVar197._24_4_ = fStack_628 * fVar208;
        auVar197._28_4_ = 0;
        auVar228 = vsubps_avx(auVar197,ZEXT1632(auVar97));
        auVar43._4_4_ = (float)local_8a0._4_4_ * fVar170;
        auVar43._0_4_ = (float)local_8a0._0_4_ * fVar145;
        auVar43._8_4_ = fStack_898 * fVar126;
        auVar43._12_4_ = fStack_894 * fVar127;
        auVar43._16_4_ = fStack_890 * fVar128;
        auVar43._20_4_ = fStack_88c * fVar198;
        auVar43._24_4_ = fStack_888 * fVar208;
        auVar43._28_4_ = 0;
        auVar165 = vsubps_avx(auVar43,ZEXT1632(auVar98));
        _local_c00 = auVar165._0_28_;
        auVar44._4_4_ = fVar213 * (float)local_660._4_4_;
        auVar44._0_4_ = fVar212 * (float)local_660._0_4_;
        auVar44._8_4_ = fVar247 * fStack_658;
        auVar44._12_4_ = fVar248 * fStack_654;
        auVar44._16_4_ = fVar249 * fStack_650;
        auVar44._20_4_ = fVar251 * fStack_64c;
        auVar44._24_4_ = fVar253 * fStack_648;
        auVar44._28_4_ = auVar165._28_4_;
        auVar165 = vsubps_avx(auVar44,ZEXT1632(auVar80));
        auVar45._4_4_ = (float)local_640._4_4_ * fVar213;
        auVar45._0_4_ = (float)local_640._0_4_ * fVar212;
        auVar45._8_4_ = fStack_638 * fVar247;
        auVar45._12_4_ = fStack_634 * fVar248;
        auVar45._16_4_ = fStack_630 * fVar249;
        auVar45._20_4_ = fStack_62c * fVar251;
        auVar45._24_4_ = fStack_628 * fVar253;
        auVar45._28_4_ = 0;
        auVar206 = vsubps_avx(auVar45,ZEXT1632(auVar74));
        auVar46._4_4_ = (float)local_8a0._4_4_ * fVar213;
        auVar46._0_4_ = (float)local_8a0._0_4_ * fVar212;
        auVar46._8_4_ = fStack_898 * fVar247;
        auVar46._12_4_ = fStack_894 * fVar248;
        auVar46._16_4_ = fStack_890 * fVar249;
        auVar46._20_4_ = fStack_88c * fVar251;
        auVar46._24_4_ = fStack_888 * fVar253;
        auVar46._28_4_ = 0;
        auVar168 = vsubps_avx(auVar46,ZEXT1632(auVar146));
        auVar192 = auVar168._0_28_;
        auVar168 = vcmpps_avx(auVar204,_DAT_01f7b000,5);
        auVar223._8_4_ = 0x7f800000;
        auVar223._0_8_ = 0x7f8000007f800000;
        auVar223._12_4_ = 0x7f800000;
        auVar223._16_4_ = 0x7f800000;
        auVar223._20_4_ = 0x7f800000;
        auVar223._24_4_ = 0x7f800000;
        auVar223._28_4_ = 0x7f800000;
        auVar222 = vblendvps_avx(auVar223,auVar40,auVar168);
        auVar204 = vandps_avx(local_680,local_340);
        auVar204 = vmaxps_avx(local_580,auVar204);
        auVar47._4_4_ = auVar204._4_4_ * 1.9073486e-06;
        auVar47._0_4_ = auVar204._0_4_ * 1.9073486e-06;
        auVar47._8_4_ = auVar204._8_4_ * 1.9073486e-06;
        auVar47._12_4_ = auVar204._12_4_ * 1.9073486e-06;
        auVar47._16_4_ = auVar204._16_4_ * 1.9073486e-06;
        auVar47._20_4_ = auVar204._20_4_ * 1.9073486e-06;
        auVar47._24_4_ = auVar204._24_4_ * 1.9073486e-06;
        auVar47._28_4_ = auVar204._28_4_;
        auVar204 = vandps_avx(local_680,local_ac0);
        auVar204 = vcmpps_avx(auVar204,auVar47,1);
        auVar242._8_4_ = 0xff800000;
        auVar242._0_8_ = 0xff800000ff800000;
        auVar242._12_4_ = 0xff800000;
        auVar242._16_4_ = 0xff800000;
        auVar242._20_4_ = 0xff800000;
        auVar242._24_4_ = 0xff800000;
        auVar242._28_4_ = 0xff800000;
        auVar241 = vblendvps_avx(auVar242,auVar41,auVar168);
        auVar11 = auVar168 & auVar204;
        if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar11 >> 0x7f,0) != '\0') ||
              (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0xbf,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar11[0x1f] < '\0') {
          auVar218 = vandps_avx(auVar168,auVar204);
          auVar204 = vcmpps_avx(auVar179,ZEXT832(0) << 0x20,2);
          auVar237._8_4_ = 0xff800000;
          auVar237._0_8_ = 0xff800000ff800000;
          auVar237._12_4_ = 0xff800000;
          auVar237._16_4_ = 0xff800000;
          auVar237._20_4_ = 0xff800000;
          auVar237._24_4_ = 0xff800000;
          auVar237._28_4_ = 0xff800000;
          auVar122._8_4_ = 0x7f800000;
          auVar122._0_8_ = 0x7f8000007f800000;
          auVar122._12_4_ = 0x7f800000;
          auVar122._16_4_ = 0x7f800000;
          auVar122._20_4_ = 0x7f800000;
          auVar122._24_4_ = 0x7f800000;
          auVar122._28_4_ = 0x7f800000;
          auVar179 = vblendvps_avx(auVar122,auVar237,auVar204);
          auVar77 = vpackssdw_avx(auVar218._0_16_,auVar218._16_16_);
          auVar11 = vpmovsxwd_avx2(auVar77);
          auVar222 = vblendvps_avx(auVar222,auVar179,auVar11);
          auVar179 = vblendvps_avx(auVar237,auVar122,auVar204);
          auVar241 = vblendvps_avx(auVar241,auVar179,auVar11);
          auVar140._0_8_ = auVar218._0_8_ ^ 0xffffffffffffffff;
          auVar140._8_4_ = auVar218._8_4_ ^ 0xffffffff;
          auVar140._12_4_ = auVar218._12_4_ ^ 0xffffffff;
          auVar140._16_4_ = auVar218._16_4_ ^ 0xffffffff;
          auVar140._20_4_ = auVar218._20_4_ ^ 0xffffffff;
          auVar140._24_4_ = auVar218._24_4_ ^ 0xffffffff;
          auVar140._28_4_ = auVar218._28_4_ ^ 0xffffffff;
          auVar218 = vorps_avx(auVar204,auVar140);
          auVar218 = vandps_avx(auVar168,auVar218);
        }
      }
      auVar238 = ZEXT3264(auVar218);
      auVar259 = ZEXT3264(auVar255);
      local_4c0 = local_a40;
      local_4a0 = vminps_avx(local_460,auVar222);
      _local_820 = vmaxps_avx(local_a40,auVar241);
      _local_480 = _local_820;
      auVar179 = vcmpps_avx(local_a40,local_4a0,2);
      local_5c0 = vandps_avx(auVar179,auVar85);
      auVar179 = vcmpps_avx(_local_820,local_460,2);
      local_840 = vandps_avx(auVar179,auVar85);
      auVar243 = ZEXT3264(local_840);
      auVar85 = vorps_avx(local_840,local_5c0);
      if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar85 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar85 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar85 >> 0x7f,0) == '\0') &&
            (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar85 >> 0xbf,0) == '\0') &&
          (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar85[0x1f])
      {
        auVar207 = ZEXT3264(local_9e0);
      }
      else {
        auStack_8dc = auVar25._4_28_;
        auVar48._4_4_ = (float)local_8a0._4_4_ * auVar192._4_4_;
        auVar48._0_4_ = (float)local_8a0._0_4_ * auVar192._0_4_;
        auVar48._8_4_ = fStack_898 * auVar192._8_4_;
        auVar48._12_4_ = fStack_894 * auVar192._12_4_;
        auVar48._16_4_ = fStack_890 * auVar192._16_4_;
        auVar48._20_4_ = fStack_88c * auVar192._20_4_;
        auVar48._24_4_ = fStack_888 * auVar192._24_4_;
        auVar48._28_4_ = auVar85._28_4_;
        auVar77 = vfmadd213ps_fma(auVar206,_local_640,auVar48);
        auVar77 = vfmadd213ps_fma(auVar165,_local_660,ZEXT1632(auVar77));
        auVar88._0_8_ = auVar218._0_8_ ^ 0xffffffffffffffff;
        auVar88._8_4_ = auVar218._8_4_ ^ 0xffffffff;
        auVar88._12_4_ = auVar218._12_4_ ^ 0xffffffff;
        auVar88._16_4_ = auVar218._16_4_ ^ 0xffffffff;
        auVar88._20_4_ = auVar218._20_4_ ^ 0xffffffff;
        auVar88._24_4_ = auVar218._24_4_ ^ 0xffffffff;
        auVar88._28_4_ = auVar218._28_4_ ^ 0xffffffff;
        auVar243 = ZEXT3264(local_680);
        auVar85 = vandps_avx(local_680,ZEXT1632(auVar77));
        auVar137._8_4_ = 0x3e99999a;
        auVar137._0_8_ = 0x3e99999a3e99999a;
        auVar137._12_4_ = 0x3e99999a;
        auVar137._16_4_ = 0x3e99999a;
        auVar137._20_4_ = 0x3e99999a;
        auVar137._24_4_ = 0x3e99999a;
        auVar137._28_4_ = 0x3e99999a;
        auVar85 = vcmpps_avx(auVar85,auVar137,1);
        local_600 = vorps_avx(auVar85,auVar88);
        auVar49._4_4_ = (float)local_8a0._4_4_ * (float)local_c00._4_4_;
        auVar49._0_4_ = (float)local_8a0._0_4_ * (float)local_c00._0_4_;
        auVar49._8_4_ = fStack_898 * fStack_bf8;
        auVar49._12_4_ = fStack_894 * fStack_bf4;
        auVar49._16_4_ = fStack_890 * fStack_bf0;
        auVar49._20_4_ = fStack_88c * fStack_bec;
        auVar49._24_4_ = fStack_888 * fStack_be8;
        auVar49._28_4_ = local_600._28_4_;
        auVar77 = vfmadd213ps_fma(auVar228,_local_640,auVar49);
        auVar77 = vfmadd213ps_fma(auVar182,_local_660,ZEXT1632(auVar77));
        auVar85 = vandps_avx(local_680,ZEXT1632(auVar77));
        auVar85 = vcmpps_avx(auVar85,auVar137,1);
        auVar85 = vorps_avx(auVar85,auVar88);
        auVar116._8_4_ = 3;
        auVar116._0_8_ = 0x300000003;
        auVar116._12_4_ = 3;
        auVar116._16_4_ = 3;
        auVar116._20_4_ = 3;
        auVar116._24_4_ = 3;
        auVar116._28_4_ = 3;
        auVar138._8_4_ = 2;
        auVar138._0_8_ = 0x200000002;
        auVar138._12_4_ = 2;
        auVar138._16_4_ = 2;
        auVar138._20_4_ = 2;
        auVar138._24_4_ = 2;
        auVar138._28_4_ = 2;
        auVar85 = vblendvps_avx(auVar138,auVar116,auVar85);
        local_620._4_4_ = local_c44;
        local_620._0_4_ = local_c44;
        local_620._8_4_ = local_c44;
        local_620._12_4_ = local_c44;
        local_620._16_4_ = local_c44;
        local_620._20_4_ = local_c44;
        local_620._24_4_ = local_c44;
        local_620._28_4_ = local_c44;
        _local_5e0 = vpcmpgtd_avx2(auVar85,local_620);
        auVar85 = vpandn_avx2(_local_5e0,local_5c0);
        local_860._4_4_ = local_a40._4_4_ + (float)local_8c0._4_4_;
        local_860._0_4_ = local_a40._0_4_ + (float)local_8c0._0_4_;
        fStack_858 = local_a40._8_4_ + fStack_8b8;
        fStack_854 = local_a40._12_4_ + fStack_8b4;
        fStack_850 = local_a40._16_4_ + fStack_8b0;
        fStack_84c = local_a40._20_4_ + fStack_8ac;
        fStack_848 = local_a40._24_4_ + fStack_8a8;
        fStack_844 = local_a40._28_4_ + fStack_8a4;
        while( true ) {
          local_4e0 = auVar85;
          fStack_b2c = auVar8._4_4_;
          fStack_b28 = auVar8._8_4_;
          fStack_b24 = auVar8._12_4_;
          if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar85 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar85 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar85 >> 0x7f,0) == '\0') &&
                (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar85 >> 0xbf,0) == '\0') &&
              (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar85[0x1f]) break;
          auVar117._8_4_ = 0x7f800000;
          auVar117._0_8_ = 0x7f8000007f800000;
          auVar117._12_4_ = 0x7f800000;
          auVar117._16_4_ = 0x7f800000;
          auVar117._20_4_ = 0x7f800000;
          auVar117._24_4_ = 0x7f800000;
          auVar117._28_4_ = 0x7f800000;
          auVar218 = vblendvps_avx(auVar117,local_a40,auVar85);
          auVar179 = vshufps_avx(auVar218,auVar218,0xb1);
          auVar179 = vminps_avx(auVar218,auVar179);
          auVar204 = vshufpd_avx(auVar179,auVar179,5);
          auVar179 = vminps_avx(auVar179,auVar204);
          auVar204 = vpermpd_avx2(auVar179,0x4e);
          auVar179 = vminps_avx(auVar179,auVar204);
          auVar218 = vcmpps_avx(auVar218,auVar179,0);
          auVar179 = auVar85 & auVar218;
          if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar179 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar179 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar179 >> 0x7f,0) != '\0') ||
                (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar179 >> 0xbf,0) != '\0') ||
              (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar179[0x1f] < '\0') {
            auVar85 = vandps_avx(auVar218,auVar85);
          }
          uVar58 = vmovmskps_avx(auVar85);
          iVar12 = 0;
          for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x80000000) {
            iVar12 = iVar12 + 1;
          }
          uVar62 = iVar12 << 2;
          *(undefined4 *)(local_4e0 + uVar62) = 0;
          uVar58 = *(uint *)(local_1a0 + uVar62);
          uVar62 = *(uint *)(local_4c0 + uVar62);
          fVar130 = auVar5._0_4_;
          auVar85 = auVar259._0_32_;
          if ((float)local_980._0_4_ < 0.0) {
            auVar238 = ZEXT1664(auVar238._0_16_);
            auVar243 = ZEXT1664(auVar243._0_16_);
            fVar130 = sqrtf((float)local_980._0_4_);
            auVar85 = auVar255;
          }
          auVar246 = ZEXT3264(auVar85);
          auVar80 = vminps_avx(auVar9,auVar70);
          auVar77 = vmaxps_avx(auVar9,auVar70);
          auVar97 = vminps_avx(auVar71,auVar8);
          auVar74 = vminps_avx(auVar80,auVar97);
          auVar80 = vmaxps_avx(auVar71,auVar8);
          auVar97 = vmaxps_avx(auVar77,auVar80);
          auVar77 = vandps_avx(auVar74,auVar225);
          auVar80 = vandps_avx(auVar97,auVar225);
          auVar77 = vmaxps_avx(auVar77,auVar80);
          auVar80 = vmovshdup_avx(auVar77);
          auVar80 = vmaxss_avx(auVar80,auVar77);
          auVar77 = vshufpd_avx(auVar77,auVar77,1);
          auVar77 = vmaxss_avx(auVar77,auVar80);
          local_9a0._0_4_ = auVar77._0_4_ * 1.9073486e-06;
          local_9c0._0_4_ = fVar130 * 1.9073486e-06;
          local_800._0_16_ = vshufps_avx(auVar97,auVar97,0xff);
          auVar77 = vinsertps_avx(ZEXT416(uVar62),ZEXT416(uVar58),0x10);
          auVar233 = ZEXT1664(auVar77);
          lVar61 = 5;
          do {
            do {
              bVar66 = lVar61 == 0;
              lVar61 = lVar61 + -1;
              auVar218 = auVar246._0_32_;
              if (bVar66) goto LAB_010ed510;
              auVar98 = auVar233._0_16_;
              local_a80._0_16_ = vmovshdup_avx(auVar98);
              fVar142 = 1.0 - local_a80._0_4_;
              auVar77 = vshufps_avx(auVar98,auVar98,0x55);
              fVar130 = auVar77._0_4_;
              auVar99._0_4_ = fVar92 * fVar130;
              fVar95 = auVar77._4_4_;
              auVar99._4_4_ = auVar70._4_4_ * fVar95;
              fVar141 = auVar77._8_4_;
              auVar99._8_4_ = auVar70._8_4_ * fVar141;
              fVar124 = auVar77._12_4_;
              auVar99._12_4_ = auVar70._12_4_ * fVar124;
              auVar131._4_4_ = fVar142;
              auVar131._0_4_ = fVar142;
              auVar131._8_4_ = fVar142;
              auVar131._12_4_ = fVar142;
              auVar77 = vfmadd231ps_fma(auVar99,auVar131,auVar9);
              auVar147._0_4_ = fVar93 * fVar130;
              auVar147._4_4_ = auVar71._4_4_ * fVar95;
              auVar147._8_4_ = auVar71._8_4_ * fVar141;
              auVar147._12_4_ = auVar71._12_4_ * fVar124;
              auVar80 = vfmadd231ps_fma(auVar147,auVar131,auVar70);
              auVar188._0_4_ = fVar130 * auVar80._0_4_;
              auVar188._4_4_ = fVar95 * auVar80._4_4_;
              auVar188._8_4_ = fVar141 * auVar80._8_4_;
              auVar188._12_4_ = fVar124 * auVar80._12_4_;
              auVar97 = vfmadd231ps_fma(auVar188,auVar131,auVar77);
              auVar100._0_4_ = fVar130 * fVar94;
              auVar100._4_4_ = fVar95 * fStack_b2c;
              auVar100._8_4_ = fVar141 * fStack_b28;
              auVar100._12_4_ = fVar124 * fStack_b24;
              auVar77 = vfmadd231ps_fma(auVar100,auVar131,auVar71);
              auVar173._0_4_ = fVar130 * auVar77._0_4_;
              auVar173._4_4_ = fVar95 * auVar77._4_4_;
              auVar173._8_4_ = fVar141 * auVar77._8_4_;
              auVar173._12_4_ = fVar124 * auVar77._12_4_;
              auVar80 = vfmadd231ps_fma(auVar173,auVar131,auVar80);
              uVar64 = auVar233._0_4_;
              auVar101._4_4_ = uVar64;
              auVar101._0_4_ = uVar64;
              auVar101._8_4_ = uVar64;
              auVar101._12_4_ = uVar64;
              auVar77 = vfmadd213ps_fma(auVar101,local_970,_DAT_01f45a50);
              auVar73._0_4_ = fVar130 * auVar80._0_4_;
              auVar73._4_4_ = fVar95 * auVar80._4_4_;
              auVar73._8_4_ = fVar141 * auVar80._8_4_;
              auVar73._12_4_ = fVar124 * auVar80._12_4_;
              auVar74 = vfmadd231ps_fma(auVar73,auVar97,auVar131);
              local_780._0_16_ = auVar74;
              auVar77 = vsubps_avx(auVar77,auVar74);
              _local_940 = auVar77;
              auVar77 = vdpps_avx(auVar77,auVar77,0x7f);
              fVar130 = auVar77._0_4_;
              if (fVar130 < 0.0) {
                local_aa0._0_16_ = ZEXT416((uint)fVar142);
                local_a00._0_16_ = auVar80;
                auVar91._0_4_ = sqrtf(fVar130);
                auVar91._4_60_ = extraout_var;
                auVar233 = ZEXT1664(auVar98);
                auVar74 = auVar91._0_16_;
                auVar80 = local_a00._0_16_;
                auVar146 = local_aa0._0_16_;
              }
              else {
                auVar74 = vsqrtss_avx(auVar77,auVar77);
                auVar146 = ZEXT416((uint)fVar142);
              }
              auVar80 = vsubps_avx(auVar80,auVar97);
              auVar216._0_4_ = auVar80._0_4_ * 3.0;
              auVar216._4_4_ = auVar80._4_4_ * 3.0;
              auVar216._8_4_ = auVar80._8_4_ * 3.0;
              auVar216._12_4_ = auVar80._12_4_ * 3.0;
              auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar146,local_a80._0_16_);
              auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_,auVar146);
              fVar95 = auVar146._0_4_ * 6.0;
              fVar141 = auVar80._0_4_ * 6.0;
              fVar124 = auVar97._0_4_ * 6.0;
              fVar142 = local_a80._0_4_ * 6.0;
              auVar148._0_4_ = fVar142 * fVar94;
              auVar148._4_4_ = fVar142 * fStack_b2c;
              auVar148._8_4_ = fVar142 * fStack_b28;
              auVar148._12_4_ = fVar142 * fStack_b24;
              auVar102._4_4_ = fVar124;
              auVar102._0_4_ = fVar124;
              auVar102._8_4_ = fVar124;
              auVar102._12_4_ = fVar124;
              auVar80 = vfmadd132ps_fma(auVar102,auVar148,auVar71);
              auVar149._4_4_ = fVar141;
              auVar149._0_4_ = fVar141;
              auVar149._8_4_ = fVar141;
              auVar149._12_4_ = fVar141;
              auVar80 = vfmadd132ps_fma(auVar149,auVar80,auVar70);
              auVar97 = vdpps_avx(auVar216,auVar216,0x7f);
              auVar103._4_4_ = fVar95;
              auVar103._0_4_ = fVar95;
              auVar103._8_4_ = fVar95;
              auVar103._12_4_ = fVar95;
              auVar172 = vfmadd132ps_fma(auVar103,auVar80,auVar9);
              auVar80 = vblendps_avx(auVar97,_DAT_01f45a50,0xe);
              auVar146 = vrsqrtss_avx(auVar80,auVar80);
              fVar124 = auVar97._0_4_;
              fVar95 = auVar146._0_4_;
              auVar146 = vdpps_avx(auVar216,auVar172,0x7f);
              fVar95 = fVar95 * 1.5 + fVar124 * -0.5 * fVar95 * fVar95 * fVar95;
              auVar104._0_4_ = auVar172._0_4_ * fVar124;
              auVar104._4_4_ = auVar172._4_4_ * fVar124;
              auVar104._8_4_ = auVar172._8_4_ * fVar124;
              auVar104._12_4_ = auVar172._12_4_ * fVar124;
              fVar141 = auVar146._0_4_;
              auVar189._0_4_ = auVar216._0_4_ * fVar141;
              auVar189._4_4_ = auVar216._4_4_ * fVar141;
              auVar189._8_4_ = auVar216._8_4_ * fVar141;
              auVar189._12_4_ = auVar216._12_4_ * fVar141;
              auVar146 = vsubps_avx(auVar104,auVar189);
              auVar80 = vrcpss_avx(auVar80,auVar80);
              auVar172 = vfnmadd213ss_fma(auVar80,auVar97,ZEXT416(0x40000000));
              fVar141 = auVar80._0_4_ * auVar172._0_4_;
              auVar80 = vmaxss_avx(ZEXT416((uint)local_9a0._0_4_),
                                   ZEXT416((uint)(auVar233._0_4_ * (float)local_9c0._0_4_)));
              auVar259 = ZEXT1664(auVar80);
              uVar13 = CONCAT44(auVar216._4_4_,auVar216._0_4_);
              auVar254._0_8_ = uVar13 ^ 0x8000000080000000;
              auVar254._8_4_ = -auVar216._8_4_;
              auVar254._12_4_ = -auVar216._12_4_;
              auVar150._0_4_ = fVar95 * auVar146._0_4_ * fVar141;
              auVar150._4_4_ = fVar95 * auVar146._4_4_ * fVar141;
              auVar150._8_4_ = fVar95 * auVar146._8_4_ * fVar141;
              auVar150._12_4_ = fVar95 * auVar146._12_4_ * fVar141;
              auVar201._0_4_ = auVar216._0_4_ * fVar95;
              auVar201._4_4_ = auVar216._4_4_ * fVar95;
              auVar201._8_4_ = auVar216._8_4_ * fVar95;
              auVar201._12_4_ = auVar216._12_4_ * fVar95;
              local_a80._0_16_ = auVar216;
              local_aa0._0_4_ = auVar80._0_4_;
              if (fVar124 < -fVar124) {
                local_a00._0_16_ = auVar254;
                local_a20._0_16_ = auVar201;
                local_ac0._0_16_ = auVar150;
                fVar95 = sqrtf(fVar124);
                auVar74 = ZEXT416(auVar74._0_4_);
                auVar259 = ZEXT464((uint)local_aa0._0_4_);
                auVar150 = local_ac0._0_16_;
                auVar201 = local_a20._0_16_;
                auVar254 = local_a00._0_16_;
              }
              else {
                auVar80 = vsqrtss_avx(auVar97,auVar97);
                fVar95 = auVar80._0_4_;
              }
              auVar80 = vdpps_avx(_local_940,auVar201,0x7f);
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)local_9a0._0_4_),auVar74,auVar259._0_16_);
              auVar97 = vdpps_avx(auVar254,auVar201,0x7f);
              auVar146 = vdpps_avx(_local_940,auVar150,0x7f);
              auVar172 = vdpps_avx(local_970,auVar201,0x7f);
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(auVar74._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_9a0._0_4_ / fVar95)),auVar69);
              auVar238 = ZEXT1664(auVar69);
              fVar95 = auVar97._0_4_ + auVar146._0_4_;
              auVar75._0_4_ = auVar80._0_4_ * auVar80._0_4_;
              auVar75._4_4_ = auVar80._4_4_ * auVar80._4_4_;
              auVar75._8_4_ = auVar80._8_4_ * auVar80._8_4_;
              auVar75._12_4_ = auVar80._12_4_ * auVar80._12_4_;
              auVar97 = vdpps_avx(_local_940,auVar254,0x7f);
              auVar146 = vsubps_avx(auVar77,auVar75);
              auVar74 = vrsqrtss_avx(auVar146,auVar146);
              fVar124 = auVar146._0_4_;
              fVar141 = auVar74._0_4_;
              fVar141 = fVar141 * 1.5 + fVar124 * -0.5 * fVar141 * fVar141 * fVar141;
              auVar74 = vdpps_avx(_local_940,local_970,0x7f);
              auVar97 = vfnmadd231ss_fma(auVar97,auVar80,ZEXT416((uint)fVar95));
              auVar74 = vfnmadd231ss_fma(auVar74,auVar80,auVar172);
              if (fVar124 < 0.0) {
                local_a00._0_16_ = auVar80;
                local_a20._0_4_ = auVar69._0_4_;
                local_ac0._0_16_ = ZEXT416((uint)fVar95);
                local_7a0._0_16_ = auVar172;
                local_7c0._0_4_ = fVar141;
                local_7e0._0_16_ = auVar74;
                fVar124 = sqrtf(fVar124);
                auVar238 = ZEXT464((uint)local_a20._0_4_);
                auVar259 = ZEXT464((uint)local_aa0._0_4_);
                fVar141 = (float)local_7c0._0_4_;
                auVar74 = local_7e0._0_16_;
                auVar172 = local_7a0._0_16_;
                auVar80 = local_a00._0_16_;
                auVar146 = local_ac0._0_16_;
              }
              else {
                auVar146 = vsqrtss_avx(auVar146,auVar146);
                fVar124 = auVar146._0_4_;
                auVar146 = ZEXT416((uint)fVar95);
              }
              auVar243 = ZEXT1664(auVar80);
              auVar246 = ZEXT3264(auVar255);
              auVar69 = vpermilps_avx(local_780._0_16_,0xff);
              fVar124 = fVar124 - auVar69._0_4_;
              auVar69 = vshufps_avx(local_a80._0_16_,local_a80._0_16_,0xff);
              auVar97 = vfmsub213ss_fma(auVar97,ZEXT416((uint)fVar141),auVar69);
              auVar151._0_8_ = auVar172._0_8_ ^ 0x8000000080000000;
              auVar151._8_4_ = auVar172._8_4_ ^ 0x80000000;
              auVar151._12_4_ = auVar172._12_4_ ^ 0x80000000;
              auVar174._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
              auVar174._8_4_ = auVar97._8_4_ ^ 0x80000000;
              auVar174._12_4_ = auVar97._12_4_ ^ 0x80000000;
              auVar96 = ZEXT416((uint)(auVar74._0_4_ * fVar141));
              auVar74 = vfmsub231ss_fma(ZEXT416((uint)(auVar97._0_4_ * auVar172._0_4_)),auVar146,
                                        auVar96);
              auVar97 = vinsertps_avx(auVar174,auVar96,0x1c);
              uVar64 = auVar74._0_4_;
              auVar175._4_4_ = uVar64;
              auVar175._0_4_ = uVar64;
              auVar175._8_4_ = uVar64;
              auVar175._12_4_ = uVar64;
              auVar97 = vdivps_avx(auVar97,auVar175);
              auVar74 = vinsertps_avx(auVar146,auVar151,0x10);
              auVar74 = vdivps_avx(auVar74,auVar175);
              fVar95 = auVar80._0_4_;
              auVar132._0_4_ = fVar95 * auVar97._0_4_ + fVar124 * auVar74._0_4_;
              auVar132._4_4_ = fVar95 * auVar97._4_4_ + fVar124 * auVar74._4_4_;
              auVar132._8_4_ = fVar95 * auVar97._8_4_ + fVar124 * auVar74._8_4_;
              auVar132._12_4_ = fVar95 * auVar97._12_4_ + fVar124 * auVar74._12_4_;
              auVar74 = vsubps_avx(auVar98,auVar132);
              auVar233 = ZEXT1664(auVar74);
              auVar97 = vandps_avx(auVar80,auVar225);
            } while (auVar238._0_4_ <= auVar97._0_4_);
            auVar98 = vfmadd231ss_fma(ZEXT416((uint)(auVar259._0_4_ + auVar238._0_4_)),
                                      local_800._0_16_,ZEXT416(0x36000000));
            auVar97 = vandps_avx(ZEXT416((uint)fVar124),auVar225);
          } while (auVar98._0_4_ <= auVar97._0_4_);
          fVar95 = auVar74._0_4_ + (float)local_910._0_4_;
          auVar97 = ZEXT416((uint)fVar95);
          auVar218 = auVar255;
          if ((fVar67 <= fVar95) && (fVar141 = *(float *)(ray + k * 4 + 0x80), fVar95 <= fVar141)) {
            auVar98 = vmovshdup_avx(auVar74);
            fVar124 = auVar98._0_4_;
            if ((0.0 <= fVar124) && (fVar124 <= 1.0)) {
              auVar77 = vrsqrtss_avx(auVar77,auVar77);
              fVar142 = auVar77._0_4_;
              pGVar3 = (context->scene->geometries).items[uVar59].ptr;
              if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar130 = fVar142 * 1.5 + fVar130 * -0.5 * fVar142 * fVar142 * fVar142;
                auVar152._0_4_ = fVar130 * (float)local_940._0_4_;
                auVar152._4_4_ = fVar130 * (float)local_940._4_4_;
                auVar152._8_4_ = fVar130 * fStack_938;
                auVar152._12_4_ = fVar130 * fStack_934;
                auVar172 = vfmadd213ps_fma(auVar69,auVar152,local_a80._0_16_);
                auVar77 = vshufps_avx(auVar152,auVar152,0xc9);
                auVar98 = vshufps_avx(local_a80._0_16_,local_a80._0_16_,0xc9);
                auVar153._0_4_ = auVar152._0_4_ * auVar98._0_4_;
                auVar153._4_4_ = auVar152._4_4_ * auVar98._4_4_;
                auVar153._8_4_ = auVar152._8_4_ * auVar98._8_4_;
                auVar153._12_4_ = auVar152._12_4_ * auVar98._12_4_;
                auVar146 = vfmsub231ps_fma(auVar153,local_a80._0_16_,auVar77);
                auVar77 = vshufps_avx(auVar146,auVar146,0xc9);
                auVar98 = vshufps_avx(auVar172,auVar172,0xc9);
                auVar146 = vshufps_avx(auVar146,auVar146,0xd2);
                auVar76._0_4_ = auVar172._0_4_ * auVar146._0_4_;
                auVar76._4_4_ = auVar172._4_4_ * auVar146._4_4_;
                auVar76._8_4_ = auVar172._8_4_ * auVar146._8_4_;
                auVar76._12_4_ = auVar172._12_4_ * auVar146._12_4_;
                auVar77 = vfmsub231ps_fma(auVar76,auVar77,auVar98);
                uVar64 = auVar77._0_4_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = fVar95;
                  uVar2 = vextractps_avx(auVar77,1);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                  uVar2 = vextractps_avx(auVar77,2);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar64;
                  *(float *)(ray + k * 4 + 0xf0) = fVar124;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x110) = local_8e0;
                  *(uint *)(ray + k * 4 + 0x120) = uVar59;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_710 = vshufps_avx(auVar74,auVar74,0x55);
                  auVar74 = vshufps_avx(auVar77,auVar77,0x55);
                  auStack_730 = vshufps_avx(auVar77,auVar77,0xaa);
                  local_740 = (RTCHitN  [16])auVar74;
                  local_720 = uVar64;
                  uStack_71c = uVar64;
                  uStack_718 = uVar64;
                  uStack_714 = uVar64;
                  local_700 = ZEXT416(0) << 0x20;
                  local_6f0 = CONCAT44(uStack_75c,local_760);
                  uStack_6e8 = CONCAT44(uStack_754,uStack_758);
                  local_6e0._4_4_ = uStack_74c;
                  local_6e0._0_4_ = local_750;
                  local_6e0._8_4_ = uStack_748;
                  local_6e0._12_4_ = uStack_744;
                  vpcmpeqd_avx2(ZEXT1632(local_6e0),ZEXT1632(local_6e0));
                  uStack_6cc = context->user->instID[0];
                  local_6d0 = uStack_6cc;
                  uStack_6c8 = uStack_6cc;
                  uStack_6c4 = uStack_6cc;
                  uStack_6c0 = context->user->instPrimID[0];
                  uStack_6bc = uStack_6c0;
                  uStack_6b8 = uStack_6c0;
                  uStack_6b4 = uStack_6c0;
                  *(float *)(ray + k * 4 + 0x80) = fVar95;
                  local_880._0_16_ = *local_a48;
                  local_af0.valid = (int *)local_880;
                  local_af0.geometryUserPtr = pGVar3->userPtr;
                  local_af0.context = context->user;
                  local_af0.hit = local_740;
                  local_af0.N = 4;
                  auVar77 = *local_a48;
                  local_af0.ray = (RTCRayN *)ray;
                  if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar238 = ZEXT1664(auVar238._0_16_);
                    auVar243 = ZEXT1664(auVar80);
                    (*pGVar3->intersectionFilterN)(&local_af0);
                    auVar123._8_56_ = extraout_var_01;
                    auVar123._0_8_ = extraout_XMM1_Qa;
                    auVar97 = auVar123._0_16_;
                    auVar77 = local_880._0_16_;
                  }
                  if (auVar77 == (undefined1  [16])0x0) {
                    auVar80 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar77 = vpcmpeqd_avx(auVar97,auVar97);
                    auVar80 = auVar80 ^ auVar77;
                  }
                  else {
                    p_Var4 = context->args->filter;
                    auVar97 = vpcmpeqd_avx(auVar74,auVar74);
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar238 = ZEXT1664(auVar238._0_16_);
                      auVar243 = ZEXT1664(auVar243._0_16_);
                      (*p_Var4)(&local_af0);
                      auVar97 = vpcmpeqd_avx(auVar97,auVar97);
                      auVar77 = local_880._0_16_;
                    }
                    auVar74 = vpcmpeqd_avx(auVar77,_DAT_01f45a50);
                    auVar80 = auVar74 ^ auVar97;
                    if (auVar77 != (undefined1  [16])0x0) {
                      auVar74 = auVar74 ^ auVar97;
                      auVar77 = vmaskmovps_avx(auVar74,*(undefined1 (*) [16])local_af0.hit);
                      *(undefined1 (*) [16])(local_af0.ray + 0xc0) = auVar77;
                      auVar77 = vmaskmovps_avx(auVar74,*(undefined1 (*) [16])(local_af0.hit + 0x10))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0xd0) = auVar77;
                      auVar77 = vmaskmovps_avx(auVar74,*(undefined1 (*) [16])(local_af0.hit + 0x20))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0xe0) = auVar77;
                      auVar77 = vmaskmovps_avx(auVar74,*(undefined1 (*) [16])(local_af0.hit + 0x30))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0xf0) = auVar77;
                      auVar77 = vmaskmovps_avx(auVar74,*(undefined1 (*) [16])(local_af0.hit + 0x40))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0x100) = auVar77;
                      auVar77 = vmaskmovps_avx(auVar74,*(undefined1 (*) [16])(local_af0.hit + 0x50))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0x110) = auVar77;
                      auVar77 = vmaskmovps_avx(auVar74,*(undefined1 (*) [16])(local_af0.hit + 0x60))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0x120) = auVar77;
                      auVar77 = vmaskmovps_avx(auVar74,*(undefined1 (*) [16])(local_af0.hit + 0x70))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0x130) = auVar77;
                      auVar77 = vmaskmovps_avx(auVar74,*(undefined1 (*) [16])(local_af0.hit + 0x80))
                      ;
                      *(undefined1 (*) [16])(local_af0.ray + 0x140) = auVar77;
                    }
                  }
                  auVar78._8_8_ = 0x100000001;
                  auVar78._0_8_ = 0x100000001;
                  if ((auVar78 & auVar80) == (undefined1  [16])0x0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar141;
                  }
                }
              }
            }
          }
LAB_010ed510:
          uVar64 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar231._4_4_ = uVar64;
          auVar231._0_4_ = uVar64;
          auVar231._8_4_ = uVar64;
          auVar231._12_4_ = uVar64;
          auVar231._16_4_ = uVar64;
          auVar231._20_4_ = uVar64;
          auVar231._24_4_ = uVar64;
          auVar231._28_4_ = uVar64;
          auVar233 = ZEXT3264(auVar231);
          auVar85 = vcmpps_avx(_local_860,auVar231,2);
          auVar85 = vandps_avx(auVar85,local_4e0);
          auVar259 = ZEXT3264(auVar218);
        }
        auVar89._0_4_ = (float)local_8c0._0_4_ + (float)local_820._0_4_;
        auVar89._4_4_ = (float)local_8c0._4_4_ + (float)local_820._4_4_;
        auVar89._8_4_ = fStack_8b8 + fStack_818;
        auVar89._12_4_ = fStack_8b4 + fStack_814;
        auVar89._16_4_ = fStack_8b0 + fStack_810;
        auVar89._20_4_ = fStack_8ac + fStack_80c;
        auVar89._24_4_ = fStack_8a8 + fStack_808;
        auVar89._28_4_ = fStack_8a4 + fStack_804;
        uVar64 = auVar233._0_4_;
        auVar118._4_4_ = uVar64;
        auVar118._0_4_ = uVar64;
        auVar118._8_4_ = uVar64;
        auVar118._12_4_ = uVar64;
        auVar118._16_4_ = uVar64;
        auVar118._20_4_ = uVar64;
        auVar118._24_4_ = uVar64;
        auVar118._28_4_ = uVar64;
        auVar85 = vcmpps_avx(auVar89,auVar118,2);
        local_840 = vandps_avx(auVar85,local_840);
        auVar90._8_4_ = 3;
        auVar90._0_8_ = 0x300000003;
        auVar90._12_4_ = 3;
        auVar90._16_4_ = 3;
        auVar90._20_4_ = 3;
        auVar90._24_4_ = 3;
        auVar90._28_4_ = 3;
        auVar119._8_4_ = 2;
        auVar119._0_8_ = 0x200000002;
        auVar119._12_4_ = 2;
        auVar119._16_4_ = 2;
        auVar119._20_4_ = 2;
        auVar119._24_4_ = 2;
        auVar119._28_4_ = 2;
        auVar85 = vblendvps_avx(auVar119,auVar90,local_600);
        _local_860 = vpcmpgtd_avx2(auVar85,local_620);
        local_880 = vpandn_avx2(_local_860,local_840);
        local_a40 = _local_480;
        local_820._4_4_ = (float)local_8c0._4_4_ + (float)local_480._4_4_;
        local_820._0_4_ = (float)local_8c0._0_4_ + (float)local_480._0_4_;
        fStack_818 = fStack_8b8 + fStack_478;
        fStack_814 = fStack_8b4 + fStack_474;
        fStack_810 = fStack_8b0 + fStack_470;
        fStack_80c = fStack_8ac + fStack_46c;
        fStack_808 = fStack_8a8 + fStack_468;
        fStack_804 = fStack_8a4 + fStack_464;
        auVar207 = ZEXT3264(local_9e0);
        for (; (((((((local_880 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                    (local_880 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (local_880 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  SUB321(local_880 >> 0x7f,0) != '\0') ||
                 (local_880 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                SUB321(local_880 >> 0xbf,0) != '\0') ||
               (local_880 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               local_880[0x1f] < '\0'; local_880 = vandps_avx(auVar85,local_880)) {
          auVar120._8_4_ = 0x7f800000;
          auVar120._0_8_ = 0x7f8000007f800000;
          auVar120._12_4_ = 0x7f800000;
          auVar120._16_4_ = 0x7f800000;
          auVar120._20_4_ = 0x7f800000;
          auVar120._24_4_ = 0x7f800000;
          auVar120._28_4_ = 0x7f800000;
          auVar85 = vblendvps_avx(auVar120,local_a40,local_880);
          auVar218 = vshufps_avx(auVar85,auVar85,0xb1);
          auVar218 = vminps_avx(auVar85,auVar218);
          auVar179 = vshufpd_avx(auVar218,auVar218,5);
          auVar218 = vminps_avx(auVar218,auVar179);
          auVar179 = vpermpd_avx2(auVar218,0x4e);
          auVar218 = vminps_avx(auVar218,auVar179);
          auVar218 = vcmpps_avx(auVar85,auVar218,0);
          auVar179 = local_880 & auVar218;
          auVar85 = local_880;
          if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar179 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar179 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar179 >> 0x7f,0) != '\0') ||
                (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar179 >> 0xbf,0) != '\0') ||
              (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar179[0x1f] < '\0') {
            auVar85 = vandps_avx(auVar218,local_880);
          }
          uVar58 = vmovmskps_avx(auVar85);
          iVar12 = 0;
          for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x80000000) {
            iVar12 = iVar12 + 1;
          }
          uVar62 = iVar12 << 2;
          *(undefined4 *)(local_880 + uVar62) = 0;
          uVar58 = *(uint *)(local_1c0 + uVar62);
          uVar62 = *(uint *)(local_460 + uVar62);
          fVar130 = auVar7._0_4_;
          if ((float)local_980._0_4_ < 0.0) {
            auVar238 = ZEXT1664(auVar238._0_16_);
            auVar243 = ZEXT1664(auVar243._0_16_);
            fVar130 = sqrtf((float)local_980._0_4_);
            auVar259 = ZEXT3264(auVar255);
            auVar207 = ZEXT3264(local_9e0);
          }
          auVar80 = vminps_avx(auVar9,auVar70);
          auVar77 = vmaxps_avx(auVar9,auVar70);
          auVar97 = vminps_avx(auVar71,auVar8);
          auVar74 = vminps_avx(auVar80,auVar97);
          auVar80 = vmaxps_avx(auVar71,auVar8);
          auVar97 = vmaxps_avx(auVar77,auVar80);
          auVar77 = vandps_avx(auVar74,auVar225);
          auVar80 = vandps_avx(auVar97,auVar225);
          auVar77 = vmaxps_avx(auVar77,auVar80);
          auVar80 = vmovshdup_avx(auVar77);
          auVar80 = vmaxss_avx(auVar80,auVar77);
          auVar77 = vshufpd_avx(auVar77,auVar77,1);
          auVar77 = vmaxss_avx(auVar77,auVar80);
          local_9a0._0_4_ = auVar77._0_4_ * 1.9073486e-06;
          local_a00._0_4_ = fVar130 * 1.9073486e-06;
          local_800._0_16_ = vshufps_avx(auVar97,auVar97,0xff);
          auVar77 = vinsertps_avx(ZEXT416(uVar62),ZEXT416(uVar58),0x10);
          auVar233 = ZEXT1664(auVar77);
          lVar61 = 5;
          do {
            do {
              bVar66 = lVar61 == 0;
              lVar61 = lVar61 + -1;
              if (bVar66) goto LAB_010edffb;
              auVar74 = auVar233._0_16_;
              local_a80._0_16_ = vmovshdup_avx(auVar74);
              fVar142 = 1.0 - local_a80._0_4_;
              auVar77 = vshufps_avx(auVar74,auVar74,0x55);
              fVar130 = auVar77._0_4_;
              auVar105._0_4_ = fVar92 * fVar130;
              fVar95 = auVar77._4_4_;
              auVar105._4_4_ = auVar70._4_4_ * fVar95;
              fVar141 = auVar77._8_4_;
              auVar105._8_4_ = auVar70._8_4_ * fVar141;
              fVar124 = auVar77._12_4_;
              auVar105._12_4_ = auVar70._12_4_ * fVar124;
              auVar133._4_4_ = fVar142;
              auVar133._0_4_ = fVar142;
              auVar133._8_4_ = fVar142;
              auVar133._12_4_ = fVar142;
              auVar77 = vfmadd231ps_fma(auVar105,auVar133,auVar9);
              auVar154._0_4_ = fVar93 * fVar130;
              auVar154._4_4_ = auVar71._4_4_ * fVar95;
              auVar154._8_4_ = auVar71._8_4_ * fVar141;
              auVar154._12_4_ = auVar71._12_4_ * fVar124;
              auVar80 = vfmadd231ps_fma(auVar154,auVar133,auVar70);
              auVar190._0_4_ = fVar130 * auVar80._0_4_;
              auVar190._4_4_ = fVar95 * auVar80._4_4_;
              auVar190._8_4_ = fVar141 * auVar80._8_4_;
              auVar190._12_4_ = fVar124 * auVar80._12_4_;
              auVar97 = vfmadd231ps_fma(auVar190,auVar133,auVar77);
              auVar106._0_4_ = fVar130 * fVar94;
              auVar106._4_4_ = fVar95 * fStack_b2c;
              auVar106._8_4_ = fVar141 * fStack_b28;
              auVar106._12_4_ = fVar124 * fStack_b24;
              auVar77 = vfmadd231ps_fma(auVar106,auVar133,auVar71);
              auVar176._0_4_ = fVar130 * auVar77._0_4_;
              auVar176._4_4_ = fVar95 * auVar77._4_4_;
              auVar176._8_4_ = fVar141 * auVar77._8_4_;
              auVar176._12_4_ = fVar124 * auVar77._12_4_;
              local_9c0._0_16_ = vfmadd231ps_fma(auVar176,auVar133,auVar80);
              uVar64 = auVar233._0_4_;
              auVar107._4_4_ = uVar64;
              auVar107._0_4_ = uVar64;
              auVar107._8_4_ = uVar64;
              auVar107._12_4_ = uVar64;
              auVar77 = vfmadd213ps_fma(auVar107,local_970,_DAT_01f45a50);
              auVar79._0_4_ = fVar130 * local_9c0._0_4_;
              auVar79._4_4_ = fVar95 * local_9c0._4_4_;
              auVar79._8_4_ = fVar141 * local_9c0._8_4_;
              auVar79._12_4_ = fVar124 * local_9c0._12_4_;
              auVar80 = vfmadd231ps_fma(auVar79,auVar97,auVar133);
              local_780._0_16_ = auVar80;
              auVar77 = vsubps_avx(auVar77,auVar80);
              _local_940 = auVar77;
              auVar77 = vdpps_avx(auVar77,auVar77,0x7f);
              fVar130 = auVar77._0_4_;
              if (fVar130 < 0.0) {
                local_aa0._0_16_ = ZEXT416((uint)fVar142);
                auVar246._0_4_ = sqrtf(fVar130);
                auVar246._4_60_ = extraout_var_00;
                auVar233 = ZEXT1664(auVar74);
                auVar80 = auVar246._0_16_;
                auVar98 = local_aa0._0_16_;
              }
              else {
                auVar80 = vsqrtss_avx(auVar77,auVar77);
                auVar98 = ZEXT416((uint)fVar142);
              }
              auVar97 = vsubps_avx(local_9c0._0_16_,auVar97);
              auVar202._0_4_ = auVar97._0_4_ * 3.0;
              auVar202._4_4_ = auVar97._4_4_ * 3.0;
              auVar202._8_4_ = auVar97._8_4_ * 3.0;
              auVar202._12_4_ = auVar97._12_4_ * 3.0;
              auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar98,local_a80._0_16_);
              auVar146 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a80._0_16_,auVar98);
              fVar95 = auVar98._0_4_ * 6.0;
              fVar141 = auVar97._0_4_ * 6.0;
              fVar124 = auVar146._0_4_ * 6.0;
              fVar142 = local_a80._0_4_ * 6.0;
              auVar155._0_4_ = fVar142 * fVar94;
              auVar155._4_4_ = fVar142 * fStack_b2c;
              auVar155._8_4_ = fVar142 * fStack_b28;
              auVar155._12_4_ = fVar142 * fStack_b24;
              auVar108._4_4_ = fVar124;
              auVar108._0_4_ = fVar124;
              auVar108._8_4_ = fVar124;
              auVar108._12_4_ = fVar124;
              auVar97 = vfmadd132ps_fma(auVar108,auVar155,auVar71);
              auVar156._4_4_ = fVar141;
              auVar156._0_4_ = fVar141;
              auVar156._8_4_ = fVar141;
              auVar156._12_4_ = fVar141;
              auVar97 = vfmadd132ps_fma(auVar156,auVar97,auVar70);
              auVar98 = vdpps_avx(auVar202,auVar202,0x7f);
              auVar109._4_4_ = fVar95;
              auVar109._0_4_ = fVar95;
              auVar109._8_4_ = fVar95;
              auVar109._12_4_ = fVar95;
              auVar172 = vfmadd132ps_fma(auVar109,auVar97,auVar9);
              auVar97 = vblendps_avx(auVar98,_DAT_01f45a50,0xe);
              auVar146 = vrsqrtss_avx(auVar97,auVar97);
              fVar124 = auVar98._0_4_;
              fVar95 = auVar146._0_4_;
              auVar146 = vdpps_avx(auVar202,auVar172,0x7f);
              fVar95 = fVar95 * 1.5 + fVar124 * -0.5 * fVar95 * fVar95 * fVar95;
              auVar110._0_4_ = auVar172._0_4_ * fVar124;
              auVar110._4_4_ = auVar172._4_4_ * fVar124;
              auVar110._8_4_ = auVar172._8_4_ * fVar124;
              auVar110._12_4_ = auVar172._12_4_ * fVar124;
              fVar141 = auVar146._0_4_;
              auVar191._0_4_ = auVar202._0_4_ * fVar141;
              auVar191._4_4_ = auVar202._4_4_ * fVar141;
              auVar191._8_4_ = auVar202._8_4_ * fVar141;
              auVar191._12_4_ = auVar202._12_4_ * fVar141;
              auVar146 = vsubps_avx(auVar110,auVar191);
              auVar97 = vrcpss_avx(auVar97,auVar97);
              auVar172 = vfnmadd213ss_fma(auVar97,auVar98,ZEXT416(0x40000000));
              fVar141 = auVar97._0_4_ * auVar172._0_4_;
              auVar97 = vmaxss_avx(ZEXT416((uint)local_9a0._0_4_),
                                   ZEXT416((uint)(auVar233._0_4_ * (float)local_a00._0_4_)));
              auVar243 = ZEXT1664(auVar97);
              uVar13 = CONCAT44(auVar202._4_4_,auVar202._0_4_);
              local_9c0._0_8_ = uVar13 ^ 0x8000000080000000;
              local_9c0._8_4_ = -auVar202._8_4_;
              local_9c0._12_4_ = -auVar202._12_4_;
              auVar157._0_4_ = fVar95 * auVar146._0_4_ * fVar141;
              auVar157._4_4_ = fVar95 * auVar146._4_4_ * fVar141;
              auVar157._8_4_ = fVar95 * auVar146._8_4_ * fVar141;
              auVar157._12_4_ = fVar95 * auVar146._12_4_ * fVar141;
              auVar217._0_4_ = auVar202._0_4_ * fVar95;
              auVar217._4_4_ = auVar202._4_4_ * fVar95;
              auVar217._8_4_ = auVar202._8_4_ * fVar95;
              auVar217._12_4_ = auVar202._12_4_ * fVar95;
              local_a80._0_16_ = auVar202;
              local_aa0._0_4_ = auVar97._0_4_;
              if (fVar124 < -fVar124) {
                local_a20._0_16_ = auVar217;
                local_ac0._0_16_ = auVar157;
                fVar95 = sqrtf(fVar124);
                auVar80 = ZEXT416(auVar80._0_4_);
                auVar243 = ZEXT464((uint)local_aa0._0_4_);
                auVar157 = local_ac0._0_16_;
                auVar217 = local_a20._0_16_;
              }
              else {
                auVar97 = vsqrtss_avx(auVar98,auVar98);
                fVar95 = auVar97._0_4_;
              }
              auVar97 = vdpps_avx(_local_940,auVar217,0x7f);
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)local_9a0._0_4_),auVar80,auVar243._0_16_);
              auVar98 = vdpps_avx(local_9c0._0_16_,auVar217,0x7f);
              auVar146 = vdpps_avx(_local_940,auVar157,0x7f);
              auVar172 = vdpps_avx(local_970,auVar217,0x7f);
              auVar171 = vfmadd213ss_fma(ZEXT416((uint)(auVar80._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_9a0._0_4_ / fVar95)),auVar69);
              auVar81._0_4_ = auVar97._0_4_ * auVar97._0_4_;
              auVar81._4_4_ = auVar97._4_4_ * auVar97._4_4_;
              auVar81._8_4_ = auVar97._8_4_ * auVar97._8_4_;
              auVar81._12_4_ = auVar97._12_4_ * auVar97._12_4_;
              auVar80 = vdpps_avx(_local_940,local_9c0._0_16_,0x7f);
              auVar96 = vsubps_avx(auVar77,auVar81);
              auVar69 = vrsqrtss_avx(auVar96,auVar96);
              fVar141 = auVar96._0_4_;
              fVar95 = auVar69._0_4_;
              fVar95 = fVar95 * 1.5 + fVar141 * -0.5 * fVar95 * fVar95 * fVar95;
              auVar69 = vdpps_avx(_local_940,local_970,0x7f);
              local_9c0._0_16_ = ZEXT416((uint)(auVar98._0_4_ + auVar146._0_4_));
              auVar80 = vfnmadd231ss_fma(auVar80,auVar97,local_9c0._0_16_);
              auVar98 = vfnmadd231ss_fma(auVar69,auVar97,auVar172);
              if (fVar141 < 0.0) {
                local_a20._0_16_ = auVar97;
                local_ac0._0_16_ = auVar172;
                local_7a0._0_16_ = auVar80;
                local_7c0._0_4_ = fVar95;
                local_7e0._0_16_ = auVar98;
                fVar141 = sqrtf(fVar141);
                auVar243 = ZEXT464((uint)local_aa0._0_4_);
                fVar95 = (float)local_7c0._0_4_;
                auVar98 = local_7e0._0_16_;
                auVar172 = local_ac0._0_16_;
                auVar80 = local_7a0._0_16_;
                auVar97 = local_a20._0_16_;
              }
              else {
                auVar146 = vsqrtss_avx(auVar96,auVar96);
                fVar141 = auVar146._0_4_;
              }
              auVar238 = ZEXT1664(auVar77);
              auVar207 = ZEXT3264(local_9e0);
              auVar259 = ZEXT3264(auVar255);
              auVar146 = vpermilps_avx(local_780._0_16_,0xff);
              fVar141 = fVar141 - auVar146._0_4_;
              auVar146 = vshufps_avx(local_a80._0_16_,local_a80._0_16_,0xff);
              auVar80 = vfmsub213ss_fma(auVar80,ZEXT416((uint)fVar95),auVar146);
              auVar158._0_8_ = auVar172._0_8_ ^ 0x8000000080000000;
              auVar158._8_4_ = auVar172._8_4_ ^ 0x80000000;
              auVar158._12_4_ = auVar172._12_4_ ^ 0x80000000;
              auVar177._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
              auVar177._8_4_ = auVar80._8_4_ ^ 0x80000000;
              auVar177._12_4_ = auVar80._12_4_ ^ 0x80000000;
              auVar69 = ZEXT416((uint)(auVar98._0_4_ * fVar95));
              auVar98 = vfmsub231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar172._0_4_)),
                                        local_9c0._0_16_,auVar69);
              auVar80 = vinsertps_avx(auVar177,auVar69,0x1c);
              uVar64 = auVar98._0_4_;
              auVar178._4_4_ = uVar64;
              auVar178._0_4_ = uVar64;
              auVar178._8_4_ = uVar64;
              auVar178._12_4_ = uVar64;
              auVar80 = vdivps_avx(auVar80,auVar178);
              auVar98 = vinsertps_avx(local_9c0._0_16_,auVar158,0x10);
              auVar98 = vdivps_avx(auVar98,auVar178);
              fVar95 = auVar97._0_4_;
              auVar134._0_4_ = fVar95 * auVar80._0_4_ + fVar141 * auVar98._0_4_;
              auVar134._4_4_ = fVar95 * auVar80._4_4_ + fVar141 * auVar98._4_4_;
              auVar134._8_4_ = fVar95 * auVar80._8_4_ + fVar141 * auVar98._8_4_;
              auVar134._12_4_ = fVar95 * auVar80._12_4_ + fVar141 * auVar98._12_4_;
              auVar74 = vsubps_avx(auVar74,auVar134);
              auVar233 = ZEXT1664(auVar74);
              auVar80 = vandps_avx(auVar97,auVar225);
            } while (auVar171._0_4_ <= auVar80._0_4_);
            auVar97 = vfmadd231ss_fma(ZEXT416((uint)(auVar243._0_4_ + auVar171._0_4_)),
                                      local_800._0_16_,ZEXT416(0x36000000));
            auVar80 = vandps_avx(ZEXT416((uint)fVar141),auVar225);
          } while (auVar97._0_4_ <= auVar80._0_4_);
          fVar95 = auVar74._0_4_ + (float)local_910._0_4_;
          auVar80 = ZEXT416((uint)fVar95);
          if (fVar67 <= fVar95) {
            fVar141 = *(float *)(ray + k * 4 + 0x80);
            auVar243 = ZEXT464((uint)fVar141);
            if (fVar95 <= fVar141) {
              auVar97 = vmovshdup_avx(auVar74);
              fVar124 = auVar97._0_4_;
              if ((0.0 <= fVar124) && (fVar124 <= 1.0)) {
                auVar97 = vrsqrtss_avx(auVar77,auVar77);
                fVar142 = auVar97._0_4_;
                pGVar3 = (context->scene->geometries).items[uVar59].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar130 = fVar142 * 1.5 + fVar130 * -0.5 * fVar142 * fVar142 * fVar142;
                  auVar159._0_4_ = fVar130 * (float)local_940._0_4_;
                  auVar159._4_4_ = fVar130 * (float)local_940._4_4_;
                  auVar159._8_4_ = fVar130 * fStack_938;
                  auVar159._12_4_ = fVar130 * fStack_934;
                  auVar172 = vfmadd213ps_fma(auVar146,auVar159,local_a80._0_16_);
                  auVar97 = vshufps_avx(auVar159,auVar159,0xc9);
                  auVar98 = vshufps_avx(local_a80._0_16_,local_a80._0_16_,0xc9);
                  auVar160._0_4_ = auVar159._0_4_ * auVar98._0_4_;
                  auVar160._4_4_ = auVar159._4_4_ * auVar98._4_4_;
                  auVar160._8_4_ = auVar159._8_4_ * auVar98._8_4_;
                  auVar160._12_4_ = auVar159._12_4_ * auVar98._12_4_;
                  auVar146 = vfmsub231ps_fma(auVar160,local_a80._0_16_,auVar97);
                  auVar97 = vshufps_avx(auVar146,auVar146,0xc9);
                  auVar98 = vshufps_avx(auVar172,auVar172,0xc9);
                  auVar146 = vshufps_avx(auVar146,auVar146,0xd2);
                  auVar82._0_4_ = auVar172._0_4_ * auVar146._0_4_;
                  auVar82._4_4_ = auVar172._4_4_ * auVar146._4_4_;
                  auVar82._8_4_ = auVar172._8_4_ * auVar146._8_4_;
                  auVar82._12_4_ = auVar172._12_4_ * auVar146._12_4_;
                  auVar97 = vfmsub231ps_fma(auVar82,auVar97,auVar98);
                  uVar64 = auVar97._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar95;
                    uVar2 = vextractps_avx(auVar97,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                    uVar2 = vextractps_avx(auVar97,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar64;
                    *(float *)(ray + k * 4 + 0xf0) = fVar124;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(undefined4 *)(ray + k * 4 + 0x110) = local_8e0;
                    *(uint *)(ray + k * 4 + 0x120) = uVar59;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_710 = vshufps_avx(auVar74,auVar74,0x55);
                    auVar74 = vshufps_avx(auVar97,auVar97,0x55);
                    auStack_730 = vshufps_avx(auVar97,auVar97,0xaa);
                    local_740 = (RTCHitN  [16])auVar74;
                    local_720 = uVar64;
                    uStack_71c = uVar64;
                    uStack_718 = uVar64;
                    uStack_714 = uVar64;
                    local_700 = ZEXT416(0) << 0x20;
                    local_6f0 = CONCAT44(uStack_75c,local_760);
                    uStack_6e8 = CONCAT44(uStack_754,uStack_758);
                    local_6e0._4_4_ = uStack_74c;
                    local_6e0._0_4_ = local_750;
                    local_6e0._8_4_ = uStack_748;
                    local_6e0._12_4_ = uStack_744;
                    vpcmpeqd_avx2(ZEXT1632(local_6e0),ZEXT1632(local_6e0));
                    uStack_6cc = context->user->instID[0];
                    local_6d0 = uStack_6cc;
                    uStack_6c8 = uStack_6cc;
                    uStack_6c4 = uStack_6cc;
                    uStack_6c0 = context->user->instPrimID[0];
                    uStack_6bc = uStack_6c0;
                    uStack_6b8 = uStack_6c0;
                    uStack_6b4 = uStack_6c0;
                    *(float *)(ray + k * 4 + 0x80) = fVar95;
                    local_900 = *local_a48;
                    local_af0.valid = (int *)local_900;
                    local_af0.geometryUserPtr = pGVar3->userPtr;
                    local_af0.context = context->user;
                    local_af0.hit = local_740;
                    local_af0.N = 4;
                    local_af0.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar238 = ZEXT1664(auVar77);
                      (*pGVar3->intersectionFilterN)(&local_af0);
                      auVar259._8_56_ = extraout_var_02;
                      auVar259._0_8_ = extraout_XMM1_Qa_00;
                      auVar80 = auVar259._0_16_;
                      auVar207 = ZEXT3264(local_9e0);
                    }
                    if (local_900 == (undefined1  [16])0x0) {
                      auVar77 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar80 = vpcmpeqd_avx(auVar80,auVar80);
                      auVar77 = auVar77 ^ auVar80;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      auVar80 = vpcmpeqd_avx(auVar74,auVar74);
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar238 = ZEXT1664(auVar238._0_16_);
                        (*p_Var4)(&local_af0);
                        auVar207 = ZEXT3264(local_9e0);
                        auVar80 = vpcmpeqd_avx(auVar80,auVar80);
                      }
                      auVar97 = vpcmpeqd_avx(local_900,_DAT_01f45a50);
                      auVar77 = auVar97 ^ auVar80;
                      if (local_900 != (undefined1  [16])0x0) {
                        auVar97 = auVar97 ^ auVar80;
                        auVar80 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])local_af0.hit);
                        *(undefined1 (*) [16])(local_af0.ray + 0xc0) = auVar80;
                        auVar80 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x10));
                        *(undefined1 (*) [16])(local_af0.ray + 0xd0) = auVar80;
                        auVar80 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x20));
                        *(undefined1 (*) [16])(local_af0.ray + 0xe0) = auVar80;
                        auVar80 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x30));
                        *(undefined1 (*) [16])(local_af0.ray + 0xf0) = auVar80;
                        auVar80 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x40));
                        *(undefined1 (*) [16])(local_af0.ray + 0x100) = auVar80;
                        auVar80 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x50));
                        *(undefined1 (*) [16])(local_af0.ray + 0x110) = auVar80;
                        auVar80 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x60));
                        *(undefined1 (*) [16])(local_af0.ray + 0x120) = auVar80;
                        auVar80 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x70));
                        *(undefined1 (*) [16])(local_af0.ray + 0x130) = auVar80;
                        auVar80 = vmaskmovps_avx(auVar97,*(undefined1 (*) [16])
                                                          (local_af0.hit + 0x80));
                        *(undefined1 (*) [16])(local_af0.ray + 0x140) = auVar80;
                      }
                    }
                    auVar243 = ZEXT464((uint)fVar141);
                    auVar259 = ZEXT3264(auVar255);
                    auVar83._8_8_ = 0x100000001;
                    auVar83._0_8_ = 0x100000001;
                    if ((auVar83 & auVar77) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar141;
                    }
                  }
                }
              }
            }
          }
LAB_010edffb:
          uVar64 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar232._4_4_ = uVar64;
          auVar232._0_4_ = uVar64;
          auVar232._8_4_ = uVar64;
          auVar232._12_4_ = uVar64;
          auVar232._16_4_ = uVar64;
          auVar232._20_4_ = uVar64;
          auVar232._24_4_ = uVar64;
          auVar232._28_4_ = uVar64;
          auVar233 = ZEXT3264(auVar232);
          auVar85 = vcmpps_avx(_local_820,auVar232,2);
        }
        auVar121._0_4_ = (float)local_8c0._0_4_ + local_4c0._0_4_;
        auVar121._4_4_ = (float)local_8c0._4_4_ + local_4c0._4_4_;
        auVar121._8_4_ = fStack_8b8 + local_4c0._8_4_;
        auVar121._12_4_ = fStack_8b4 + local_4c0._12_4_;
        auVar121._16_4_ = fStack_8b0 + local_4c0._16_4_;
        auVar121._20_4_ = fStack_8ac + local_4c0._20_4_;
        auVar121._24_4_ = fStack_8a8 + local_4c0._24_4_;
        auVar121._28_4_ = fStack_8a4 + local_4c0._28_4_;
        uVar64 = auVar233._0_4_;
        auVar169._4_4_ = uVar64;
        auVar169._0_4_ = uVar64;
        auVar169._8_4_ = uVar64;
        auVar169._12_4_ = uVar64;
        auVar169._16_4_ = uVar64;
        auVar169._20_4_ = uVar64;
        auVar169._24_4_ = uVar64;
        auVar169._28_4_ = uVar64;
        auVar218 = vcmpps_avx(auVar121,auVar169,2);
        auVar85 = vandps_avx(_local_5e0,local_5c0);
        auVar85 = vandps_avx(auVar218,auVar85);
        auVar183._0_4_ = (float)local_8c0._0_4_ + local_480._0_4_;
        auVar183._4_4_ = (float)local_8c0._4_4_ + local_480._4_4_;
        auVar183._8_4_ = fStack_8b8 + local_480._8_4_;
        auVar183._12_4_ = fStack_8b4 + local_480._12_4_;
        auVar183._16_4_ = fStack_8b0 + local_480._16_4_;
        auVar183._20_4_ = fStack_8ac + local_480._20_4_;
        auVar183._24_4_ = fStack_8a8 + local_480._24_4_;
        auVar183._28_4_ = fStack_8a4 + local_480._28_4_;
        auVar179 = vcmpps_avx(auVar183,auVar169,2);
        auVar218 = vandps_avx(_local_860,local_840);
        auVar218 = vandps_avx(auVar179,auVar218);
        auVar218 = vorps_avx(auVar85,auVar218);
        if ((((((((auVar218 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar218 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar218 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar218 >> 0x7f,0) != '\0') ||
              (auVar218 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar218 >> 0xbf,0) != '\0') ||
            (auVar218 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar218[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar60 * 0x60) = auVar218;
          auVar85 = vblendvps_avx(_local_480,local_4c0,auVar85);
          *(undefined1 (*) [32])(auStack_160 + uVar60 * 0x60) = auVar85;
          uVar13 = vmovlps_avx(local_590);
          (&uStack_140)[uVar60 * 0xc] = uVar13;
          aiStack_138[uVar60 * 0x18] = local_c44 + 1;
          uVar60 = (ulong)((int)uVar60 + 1);
        }
        fVar130 = (float)local_8c0._0_4_;
        fVar141 = (float)local_8c0._4_4_;
        fVar142 = fStack_8b8;
        fVar143 = fStack_8b4;
        fVar144 = fStack_8b0;
        fVar209 = fStack_8ac;
        fVar210 = fStack_8a8;
        fVar211 = fStack_8a4;
      }
      auVar246 = ZEXT3264(CONCAT824(uStack_948,CONCAT816(uStack_950,CONCAT88(uStack_958,local_960)))
                         );
    }
    while( true ) {
      auVar218 = local_540;
      auVar179 = local_560;
      uVar58 = (uint)uVar60;
      if (uVar58 == 0) {
        uVar64 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar84._4_4_ = uVar64;
        auVar84._0_4_ = uVar64;
        auVar84._8_4_ = uVar64;
        auVar84._12_4_ = uVar64;
        auVar5 = vcmpps_avx(local_5a0,auVar84,2);
        uVar59 = vmovmskps_avx(auVar5);
        uVar65 = (ulong)((uint)uVar65 & uVar59);
        goto LAB_010ebc3d;
      }
      uVar60 = (ulong)(uVar58 - 1);
      lVar61 = uVar60 * 0x60;
      auVar85 = *(undefined1 (*) [32])(auStack_160 + lVar61);
      auVar86._0_4_ = fVar130 + auVar85._0_4_;
      auVar86._4_4_ = fVar141 + auVar85._4_4_;
      auVar86._8_4_ = fVar142 + auVar85._8_4_;
      auVar86._12_4_ = fVar143 + auVar85._12_4_;
      auVar86._16_4_ = fVar144 + auVar85._16_4_;
      auVar86._20_4_ = fVar209 + auVar85._20_4_;
      auVar86._24_4_ = fVar210 + auVar85._24_4_;
      auVar86._28_4_ = fVar211 + auVar85._28_4_;
      uVar64 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar164._4_4_ = uVar64;
      auVar164._0_4_ = uVar64;
      auVar164._8_4_ = uVar64;
      auVar164._12_4_ = uVar64;
      auVar164._16_4_ = uVar64;
      auVar164._20_4_ = uVar64;
      auVar164._24_4_ = uVar64;
      auVar164._28_4_ = uVar64;
      auVar204 = vcmpps_avx(auVar86,auVar164,2);
      auVar165 = vandps_avx(auVar204,*(undefined1 (*) [32])(auStack_180 + lVar61));
      _local_740 = auVar165;
      auVar204 = *(undefined1 (*) [32])(auStack_180 + lVar61) & auVar204;
      if ((((((((auVar204 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar204 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar204 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar204 >> 0x7f,0) != '\0') ||
            (auVar204 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar204 >> 0xbf,0) != '\0') ||
          (auVar204 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar204[0x1f] < '\0') break;
      uVar60 = (ulong)(uVar58 - 1);
    }
    auVar136._8_4_ = 0x7f800000;
    auVar136._0_8_ = 0x7f8000007f800000;
    auVar136._12_4_ = 0x7f800000;
    auVar136._16_4_ = 0x7f800000;
    auVar136._20_4_ = 0x7f800000;
    auVar136._24_4_ = 0x7f800000;
    auVar136._28_4_ = 0x7f800000;
    auVar85 = vblendvps_avx(auVar136,auVar85,auVar165);
    auVar204 = vshufps_avx(auVar85,auVar85,0xb1);
    auVar204 = vminps_avx(auVar85,auVar204);
    auVar168 = vshufpd_avx(auVar204,auVar204,5);
    auVar204 = vminps_avx(auVar204,auVar168);
    auVar168 = vpermpd_avx2(auVar204,0x4e);
    auVar204 = vminps_avx(auVar204,auVar168);
    auVar85 = vcmpps_avx(auVar85,auVar204,0);
    auVar204 = auVar207._0_32_;
    auVar168 = auVar165 & auVar85;
    if ((((((((auVar168 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar168 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar168 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar168 >> 0x7f,0) != '\0') ||
          (auVar168 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar168 >> 0xbf,0) != '\0') ||
        (auVar168 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar168[0x1f] < '\0') {
      auVar165 = vandps_avx(auVar85,auVar165);
    }
    uVar62 = vmovmskps_avx(auVar165);
    iVar12 = 0;
    for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
      iVar12 = iVar12 + 1;
    }
    *(undefined4 *)(local_740 + (uint)(iVar12 << 2)) = 0;
    uVar13 = (&uStack_140)[uVar60 * 0xc];
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar13;
    local_c44 = aiStack_138[uVar60 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar61) = _local_740;
    uVar62 = uVar58 - 1;
    if ((((((((_local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_740 >> 0x7f,0) != '\0') ||
          (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_740 >> 0xbf,0) != '\0') ||
        (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_740[0x1f] < '\0') {
      uVar62 = uVar58;
    }
    uVar64 = (undefined4)uVar13;
    auVar115._4_4_ = uVar64;
    auVar115._0_4_ = uVar64;
    auVar115._8_4_ = uVar64;
    auVar115._12_4_ = uVar64;
    auVar115._16_4_ = uVar64;
    auVar115._20_4_ = uVar64;
    auVar115._24_4_ = uVar64;
    auVar115._28_4_ = uVar64;
    auVar77 = vmovshdup_avx(auVar72);
    auVar77 = vsubps_avx(auVar77,auVar72);
    auVar87._0_4_ = auVar77._0_4_;
    auVar87._4_4_ = auVar87._0_4_;
    auVar87._8_4_ = auVar87._0_4_;
    auVar87._12_4_ = auVar87._0_4_;
    auVar87._16_4_ = auVar87._0_4_;
    auVar87._20_4_ = auVar87._0_4_;
    auVar87._24_4_ = auVar87._0_4_;
    auVar87._28_4_ = auVar87._0_4_;
    auVar77 = vfmadd132ps_fma(auVar87,auVar115,_DAT_01f7b040);
    local_4c0 = ZEXT1632(auVar77);
    local_590._8_8_ = 0;
    local_590._0_8_ = *(ulong *)(local_4c0 + (uint)(iVar12 << 2));
    uVar60 = (ulong)uVar62;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }